

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx2::CurveNvIntersector1<4>::
     occluded_t<embree::avx2::RibbonCurve1Intersector1<embree::BezierCurveT,8>,embree::avx2::Occluded1EpilogMU<8,true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  Primitive *pPVar1;
  undefined1 (*pauVar2) [32];
  float *pfVar3;
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  Primitive PVar10;
  int iVar11;
  Geometry *pGVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  long lVar24;
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  float fVar71;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [28];
  undefined1 auVar77 [28];
  undefined4 uVar78;
  ulong uVar79;
  RTCIntersectArguments *pRVar80;
  ulong uVar81;
  ulong uVar82;
  RTCFilterFunctionN p_Var83;
  uint uVar84;
  ulong uVar85;
  long lVar86;
  ulong uVar87;
  Geometry *geometry;
  long lVar88;
  undefined8 uVar89;
  float fVar103;
  vint4 bi_2;
  undefined1 auVar90 [16];
  float fVar105;
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  float fVar102;
  float fVar104;
  float fVar106;
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar94 [16];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [64];
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  vint4 bi_1;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [64];
  float fVar124;
  float fVar125;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar133 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [64];
  undefined1 auVar138 [64];
  vint4 ai_2;
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [64];
  vint4 ai;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  vint4 bi;
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  vint4 ai_1;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [64];
  undefined1 auVar169 [32];
  undefined1 auVar170 [64];
  float fVar171;
  float fVar180;
  float fVar181;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  float fVar182;
  float fVar183;
  float fVar184;
  float fVar185;
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar187 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar186 [16];
  undefined1 auVar188 [64];
  float fVar189;
  float fVar193;
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar194 [16];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar197 [64];
  undefined1 auVar198 [16];
  undefined1 auVar199 [64];
  undefined1 auVar200 [16];
  undefined1 auVar202 [32];
  undefined1 auVar203 [32];
  undefined1 auVar204 [64];
  float fVar206;
  float fVar207;
  float fVar208;
  float fVar209;
  undefined1 auVar205 [64];
  RTCFilterFunctionNArguments args;
  int local_7c4;
  long local_7c0;
  Precalculations *local_7b8;
  Primitive *local_7b0;
  undefined4 local_7a4;
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  ulong local_6e8;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  RTCFilterFunctionNArguments local_5f0;
  undefined1 local_5c0 [32];
  float local_5a0;
  float fStack_59c;
  float fStack_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float fStack_588;
  float fStack_584;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined1 local_560 [32];
  undefined1 local_530 [16];
  undefined1 local_520 [16];
  undefined8 local_510;
  undefined4 local_508;
  float local_504;
  undefined4 local_500;
  undefined4 local_4fc;
  undefined4 local_4f8;
  uint local_4f4;
  uint local_4f0;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  ulong local_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [16];
  undefined1 local_290 [16];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  int local_220;
  int local_21c;
  undefined8 local_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined1 local_160 [32];
  undefined1 local_140 [8];
  float fStack_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float fStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined4 local_100;
  undefined4 uStack_fc;
  undefined4 uStack_f8;
  undefined4 uStack_f4;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  undefined4 uStack_e8;
  undefined4 uStack_e4;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 auVar179 [64];
  undefined1 auVar201 [16];
  
  PVar10 = prim[1];
  uVar79 = (ulong)(byte)PVar10;
  fVar125 = *(float *)(prim + uVar79 * 0x19 + 0x12);
  auVar19 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar79 * 0x19 + 6));
  auVar90._0_4_ = fVar125 * auVar19._0_4_;
  auVar90._4_4_ = fVar125 * auVar19._4_4_;
  auVar90._8_4_ = fVar125 * auVar19._8_4_;
  auVar90._12_4_ = fVar125 * auVar19._12_4_;
  auVar150._0_4_ = fVar125 * (ray->dir).field_0.m128[0];
  auVar150._4_4_ = fVar125 * (ray->dir).field_0.m128[1];
  auVar150._8_4_ = fVar125 * (ray->dir).field_0.m128[2];
  auVar150._12_4_ = fVar125 * (ray->dir).field_0.m128[3];
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 4 + 6)));
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar14 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 5 + 6)));
  auVar14 = vcvtdq2ps_avx(auVar14);
  auVar15 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 6 + 6)));
  auVar15 = vcvtdq2ps_avx(auVar15);
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xb + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xc + 6)));
  auVar17 = vcvtdq2ps_avx(auVar17);
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0xd + 6)));
  auVar18 = vcvtdq2ps_avx(auVar18);
  auVar197 = ZEXT1664(auVar18);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x12 + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x13 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar126 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar79 * 0x14 + 6)));
  auVar126 = vcvtdq2ps_avx(auVar126);
  auVar199 = ZEXT1664(auVar126);
  auVar200._4_4_ = auVar150._0_4_;
  auVar200._0_4_ = auVar150._0_4_;
  auVar200._8_4_ = auVar150._0_4_;
  auVar200._12_4_ = auVar150._0_4_;
  auVar111 = vshufps_avx(auVar150,auVar150,0x55);
  auVar91 = vshufps_avx(auVar150,auVar150,0xaa);
  fVar125 = auVar91._0_4_;
  auVar186._0_4_ = fVar125 * auVar15._0_4_;
  fVar124 = auVar91._4_4_;
  auVar186._4_4_ = fVar124 * auVar15._4_4_;
  fVar103 = auVar91._8_4_;
  auVar186._8_4_ = fVar103 * auVar15._8_4_;
  fVar105 = auVar91._12_4_;
  auVar186._12_4_ = fVar105 * auVar15._12_4_;
  auVar172._0_4_ = auVar18._0_4_ * fVar125;
  auVar172._4_4_ = auVar18._4_4_ * fVar124;
  auVar172._8_4_ = auVar18._8_4_ * fVar103;
  auVar172._12_4_ = auVar18._12_4_ * fVar105;
  auVar165._0_4_ = auVar126._0_4_ * fVar125;
  auVar165._4_4_ = auVar126._4_4_ * fVar124;
  auVar165._8_4_ = auVar126._8_4_ * fVar103;
  auVar165._12_4_ = auVar126._12_4_ * fVar105;
  auVar91 = vfmadd231ps_fma(auVar186,auVar111,auVar14);
  auVar127 = vfmadd231ps_fma(auVar172,auVar111,auVar17);
  auVar111 = vfmadd231ps_fma(auVar165,auVar92,auVar111);
  auVar139 = vfmadd231ps_fma(auVar91,auVar200,auVar19);
  auVar188 = ZEXT1664(auVar139);
  auVar127 = vfmadd231ps_fma(auVar127,auVar200,auVar16);
  auVar147 = vfmadd231ps_fma(auVar111,auVar93,auVar200);
  auVar201._4_4_ = auVar90._0_4_;
  auVar201._0_4_ = auVar90._0_4_;
  auVar201._8_4_ = auVar90._0_4_;
  auVar201._12_4_ = auVar90._0_4_;
  auVar204 = ZEXT1664(auVar201);
  auVar111 = vshufps_avx(auVar90,auVar90,0x55);
  auVar91 = vshufps_avx(auVar90,auVar90,0xaa);
  fVar125 = auVar91._0_4_;
  auVar151._0_4_ = fVar125 * auVar15._0_4_;
  fVar124 = auVar91._4_4_;
  auVar151._4_4_ = fVar124 * auVar15._4_4_;
  fVar103 = auVar91._8_4_;
  auVar151._8_4_ = fVar103 * auVar15._8_4_;
  fVar105 = auVar91._12_4_;
  auVar151._12_4_ = fVar105 * auVar15._12_4_;
  auVar110._0_4_ = auVar18._0_4_ * fVar125;
  auVar110._4_4_ = auVar18._4_4_ * fVar124;
  auVar110._8_4_ = auVar18._8_4_ * fVar103;
  auVar110._12_4_ = auVar18._12_4_ * fVar105;
  auVar91._0_4_ = auVar126._0_4_ * fVar125;
  auVar91._4_4_ = auVar126._4_4_ * fVar124;
  auVar91._8_4_ = auVar126._8_4_ * fVar103;
  auVar91._12_4_ = auVar126._12_4_ * fVar105;
  auVar14 = vfmadd231ps_fma(auVar151,auVar111,auVar14);
  auVar15 = vfmadd231ps_fma(auVar110,auVar111,auVar17);
  auVar17 = vfmadd231ps_fma(auVar91,auVar111,auVar92);
  auVar18 = vfmadd231ps_fma(auVar14,auVar201,auVar19);
  auVar92 = vfmadd231ps_fma(auVar15,auVar201,auVar16);
  auVar126 = vfmadd231ps_fma(auVar17,auVar201,auVar93);
  local_290._8_4_ = 0x7fffffff;
  local_290._0_8_ = 0x7fffffff7fffffff;
  local_290._12_4_ = 0x7fffffff;
  auVar19 = vandps_avx(auVar139,local_290);
  auVar146._8_4_ = 0x219392ef;
  auVar146._0_8_ = 0x219392ef219392ef;
  auVar146._12_4_ = 0x219392ef;
  auVar19 = vcmpps_avx(auVar19,auVar146,1);
  auVar14 = vblendvps_avx(auVar139,auVar146,auVar19);
  auVar19 = vandps_avx(auVar127,local_290);
  auVar19 = vcmpps_avx(auVar19,auVar146,1);
  auVar15 = vblendvps_avx(auVar127,auVar146,auVar19);
  auVar19 = vandps_avx(local_290,auVar147);
  auVar19 = vcmpps_avx(auVar19,auVar146,1);
  auVar19 = vblendvps_avx(auVar147,auVar146,auVar19);
  auVar16 = vrcpps_avx(auVar14);
  auVar166._8_4_ = 0x3f800000;
  auVar166._0_8_ = 0x3f8000003f800000;
  auVar166._12_4_ = 0x3f800000;
  auVar14 = vfnmadd213ps_fma(auVar14,auVar16,auVar166);
  auVar16 = vfmadd132ps_fma(auVar14,auVar16,auVar16);
  auVar14 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar14,auVar166);
  auVar17 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar14 = vrcpps_avx(auVar19);
  auVar15 = vfnmadd213ps_fma(auVar19,auVar14,auVar166);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar79 * 7 + 6);
  auVar19 = vpmovsxwd_avx(auVar19);
  auVar93 = vfmadd132ps_fma(auVar15,auVar14,auVar14);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar18);
  auVar147._0_4_ = auVar16._0_4_ * auVar19._0_4_;
  auVar147._4_4_ = auVar16._4_4_ * auVar19._4_4_;
  auVar147._8_4_ = auVar16._8_4_ * auVar19._8_4_;
  auVar147._12_4_ = auVar16._12_4_ * auVar19._12_4_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = *(ulong *)(prim + uVar79 * 9 + 6);
  auVar19 = vpmovsxwd_avx(auVar14);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar14 = vsubps_avx(auVar19,auVar18);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar79 * 0xe + 6);
  auVar19 = vpmovsxwd_avx(auVar15);
  auVar152._0_4_ = auVar16._0_4_ * auVar14._0_4_;
  auVar152._4_4_ = auVar16._4_4_ * auVar14._4_4_;
  auVar152._8_4_ = auVar16._8_4_ * auVar14._8_4_;
  auVar152._12_4_ = auVar16._12_4_ * auVar14._12_4_;
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar92);
  auVar160._0_4_ = auVar17._0_4_ * auVar19._0_4_;
  auVar160._4_4_ = auVar17._4_4_ * auVar19._4_4_;
  auVar160._8_4_ = auVar17._8_4_ * auVar19._8_4_;
  auVar160._12_4_ = auVar17._12_4_ * auVar19._12_4_;
  auVar127._1_3_ = 0;
  auVar127[0] = PVar10;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar10 * 0x10 + 6);
  auVar19 = vpmovsxwd_avx(auVar16);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar92);
  auVar111._0_4_ = auVar17._0_4_ * auVar19._0_4_;
  auVar111._4_4_ = auVar17._4_4_ * auVar19._4_4_;
  auVar111._8_4_ = auVar17._8_4_ * auVar19._8_4_;
  auVar111._12_4_ = auVar17._12_4_ * auVar19._12_4_;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar79 * 0x15 + 6);
  auVar19 = vpmovsxwd_avx(auVar17);
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar14 = vsubps_avx(auVar19,auVar126);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar79 * 0x17 + 6);
  auVar19 = vpmovsxwd_avx(auVar18);
  auVar139._0_4_ = auVar93._0_4_ * auVar14._0_4_;
  auVar139._4_4_ = auVar93._4_4_ * auVar14._4_4_;
  auVar139._8_4_ = auVar93._8_4_ * auVar14._8_4_;
  auVar139._12_4_ = auVar93._12_4_ * auVar14._12_4_;
  auVar19 = vcvtdq2ps_avx(auVar19);
  auVar19 = vsubps_avx(auVar19,auVar126);
  auVar92._0_4_ = auVar93._0_4_ * auVar19._0_4_;
  auVar92._4_4_ = auVar93._4_4_ * auVar19._4_4_;
  auVar92._8_4_ = auVar93._8_4_ * auVar19._8_4_;
  auVar92._12_4_ = auVar93._12_4_ * auVar19._12_4_;
  auVar19 = vpminsd_avx(auVar147,auVar152);
  auVar14 = vpminsd_avx(auVar160,auVar111);
  auVar19 = vmaxps_avx(auVar19,auVar14);
  auVar14 = vpminsd_avx(auVar139,auVar92);
  uVar78 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar173._4_4_ = uVar78;
  auVar173._0_4_ = uVar78;
  auVar173._8_4_ = uVar78;
  auVar173._12_4_ = uVar78;
  auVar179 = ZEXT1664(auVar173);
  auVar14 = vmaxps_avx(auVar14,auVar173);
  auVar19 = vmaxps_avx(auVar19,auVar14);
  local_2a0._0_4_ = auVar19._0_4_ * 0.99999964;
  local_2a0._4_4_ = auVar19._4_4_ * 0.99999964;
  local_2a0._8_4_ = auVar19._8_4_ * 0.99999964;
  local_2a0._12_4_ = auVar19._12_4_ * 0.99999964;
  auVar19 = vpmaxsd_avx(auVar147,auVar152);
  auVar14 = vpmaxsd_avx(auVar160,auVar111);
  auVar19 = vminps_avx(auVar19,auVar14);
  auVar14 = vpmaxsd_avx(auVar139,auVar92);
  fVar125 = ray->tfar;
  auVar126._4_4_ = fVar125;
  auVar126._0_4_ = fVar125;
  auVar126._8_4_ = fVar125;
  auVar126._12_4_ = fVar125;
  auVar14 = vminps_avx(auVar14,auVar126);
  auVar19 = vminps_avx(auVar19,auVar14);
  auVar127[4] = PVar10;
  auVar127._5_3_ = 0;
  auVar127[8] = PVar10;
  auVar127._9_3_ = 0;
  auVar127[0xc] = PVar10;
  auVar127._13_3_ = 0;
  auVar14 = vpcmpgtd_avx(auVar127,_DAT_01f4ad30);
  auVar93._0_4_ = auVar19._0_4_ * 1.0000004;
  auVar93._4_4_ = auVar19._4_4_ * 1.0000004;
  auVar93._8_4_ = auVar19._8_4_ * 1.0000004;
  auVar93._12_4_ = auVar19._12_4_ * 1.0000004;
  auVar19 = vcmpps_avx(local_2a0,auVar93,2);
  auVar19 = vandps_avx(auVar19,auVar14);
  uVar84 = vmovmskps_avx(auVar19);
  local_4a0 = mm_lookupmask_ps._16_8_;
  uStack_498 = mm_lookupmask_ps._24_8_;
  uStack_490 = mm_lookupmask_ps._16_8_;
  uStack_488 = mm_lookupmask_ps._24_8_;
  local_7b8 = pre;
  local_7b0 = prim;
  for (; auVar121 = local_3e0, local_4a8 = (ulong)uVar84, local_4a8 != 0;
      uVar84 = (uint)uVar87 & uVar84) {
    auVar120 = auVar199._0_32_;
    auVar187 = auVar188._0_32_;
    local_6a0 = auVar179._0_32_;
    local_640 = auVar197._0_32_;
    lVar86 = 0;
    for (uVar82 = local_4a8; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
      lVar86 = lVar86 + 1;
    }
    uVar87 = local_4a8 - 1 & local_4a8;
    local_7a4 = *(undefined4 *)(local_7b0 + lVar86 * 4 + 6);
    uVar82 = (ulong)(uint)((int)lVar86 << 6);
    local_6e8 = (ulong)*(uint *)(local_7b0 + 2);
    pGVar12 = (context->scene->geometries).items[*(uint *)(local_7b0 + 2)].ptr;
    pPVar1 = prim + uVar82 + uVar79 * 0x19 + 0x16;
    local_600 = *(undefined8 *)pPVar1;
    uStack_5f8 = *(undefined8 *)(pPVar1 + 8);
    if (uVar87 != 0) {
      uVar85 = uVar87 - 1 & uVar87;
      for (uVar81 = uVar87; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
      }
      if (uVar85 != 0) {
        for (; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
        }
      }
    }
    local_520 = *(undefined1 (*) [16])(prim + uVar82 + uVar79 * 0x19 + 0x26);
    auVar91 = local_520;
    local_530 = *(undefined1 (*) [16])(prim + uVar82 + uVar79 * 0x19 + 0x36);
    _local_4c0 = *(undefined1 (*) [16])(prim + uVar82 + uVar79 * 0x19 + 0x46);
    iVar11 = (int)pGVar12[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
    aVar5 = (ray->org).field_0;
    auVar14 = vsubps_avx(*(undefined1 (*) [16])pPVar1,(undefined1  [16])aVar5);
    uVar78 = auVar14._0_4_;
    auVar140._4_4_ = uVar78;
    auVar140._0_4_ = uVar78;
    auVar140._8_4_ = uVar78;
    auVar140._12_4_ = uVar78;
    auVar19 = vshufps_avx(auVar14,auVar14,0x55);
    auVar14 = vshufps_avx(auVar14,auVar14,0xaa);
    aVar6 = (local_7b8->ray_space).vx.field_0;
    aVar7 = (local_7b8->ray_space).vy.field_0;
    fVar125 = (local_7b8->ray_space).vz.field_0.m128[0];
    fVar124 = (local_7b8->ray_space).vz.field_0.m128[1];
    fVar103 = (local_7b8->ray_space).vz.field_0.m128[2];
    fVar105 = (local_7b8->ray_space).vz.field_0.m128[3];
    auVar153._0_4_ = auVar14._0_4_ * fVar125;
    auVar153._4_4_ = auVar14._4_4_ * fVar124;
    auVar153._8_4_ = auVar14._8_4_ * fVar103;
    auVar153._12_4_ = auVar14._12_4_ * fVar105;
    auVar19 = vfmadd231ps_fma(auVar153,(undefined1  [16])aVar7,auVar19);
    auVar18 = vfmadd231ps_fma(auVar19,(undefined1  [16])aVar6,auVar140);
    auVar19 = vblendps_avx(auVar18,*(undefined1 (*) [16])pPVar1,8);
    auVar15 = vsubps_avx(local_520,(undefined1  [16])aVar5);
    uVar78 = auVar15._0_4_;
    auVar154._4_4_ = uVar78;
    auVar154._0_4_ = uVar78;
    auVar154._8_4_ = uVar78;
    auVar154._12_4_ = uVar78;
    auVar14 = vshufps_avx(auVar15,auVar15,0x55);
    auVar15 = vshufps_avx(auVar15,auVar15,0xaa);
    auVar190._0_4_ = auVar15._0_4_ * fVar125;
    auVar190._4_4_ = auVar15._4_4_ * fVar124;
    auVar190._8_4_ = auVar15._8_4_ * fVar103;
    auVar190._12_4_ = auVar15._12_4_ * fVar105;
    auVar14 = vfmadd231ps_fma(auVar190,(undefined1  [16])aVar7,auVar14);
    auVar93 = vfmadd231ps_fma(auVar14,(undefined1  [16])aVar6,auVar154);
    auVar14 = vblendps_avx(auVar93,local_520,8);
    auVar111 = local_530;
    auVar16 = vsubps_avx(local_530,(undefined1  [16])aVar5);
    uVar78 = auVar16._0_4_;
    auVar161._4_4_ = uVar78;
    auVar161._0_4_ = uVar78;
    auVar161._8_4_ = uVar78;
    auVar161._12_4_ = uVar78;
    auVar15 = vshufps_avx(auVar16,auVar16,0x55);
    auVar16 = vshufps_avx(auVar16,auVar16,0xaa);
    auVar194._0_4_ = auVar16._0_4_ * fVar125;
    auVar194._4_4_ = auVar16._4_4_ * fVar124;
    auVar194._8_4_ = auVar16._8_4_ * fVar103;
    auVar194._12_4_ = auVar16._12_4_ * fVar105;
    auVar15 = vfmadd231ps_fma(auVar194,(undefined1  [16])aVar7,auVar15);
    auVar92 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar6,auVar161);
    auVar15 = vblendps_avx(auVar92,local_530,8);
    auVar17 = vsubps_avx(_local_4c0,(undefined1  [16])aVar5);
    uVar78 = auVar17._0_4_;
    auVar167._4_4_ = uVar78;
    auVar167._0_4_ = uVar78;
    auVar167._8_4_ = uVar78;
    auVar167._12_4_ = uVar78;
    auVar16 = vshufps_avx(auVar17,auVar17,0x55);
    auVar17 = vshufps_avx(auVar17,auVar17,0xaa);
    auVar198._0_4_ = auVar17._0_4_ * fVar125;
    auVar198._4_4_ = auVar17._4_4_ * fVar124;
    auVar198._8_4_ = auVar17._8_4_ * fVar103;
    auVar198._12_4_ = auVar17._12_4_ * fVar105;
    auVar16 = vfmadd231ps_fma(auVar198,(undefined1  [16])aVar7,auVar16);
    auVar126 = vfmadd231ps_fma(auVar16,(undefined1  [16])aVar6,auVar167);
    auVar16 = vblendps_avx(auVar126,_local_4c0,8);
    auVar19 = vandps_avx(auVar19,local_290);
    auVar14 = vandps_avx(auVar14,local_290);
    auVar17 = vmaxps_avx(auVar19,auVar14);
    auVar19 = vandps_avx(auVar15,local_290);
    auVar14 = vandps_avx(auVar16,local_290);
    auVar19 = vmaxps_avx(auVar19,auVar14);
    auVar19 = vmaxps_avx(auVar17,auVar19);
    auVar14 = vmovshdup_avx(auVar19);
    auVar14 = vmaxss_avx(auVar14,auVar19);
    auVar19 = vshufpd_avx(auVar19,auVar19,1);
    auVar19 = vmaxss_avx(auVar19,auVar14);
    local_7c0 = (long)iVar11;
    lVar86 = local_7c0 * 0x44;
    auVar14 = vmovshdup_avx(auVar18);
    uVar89 = auVar14._0_8_;
    local_400._8_8_ = uVar89;
    local_400._0_8_ = uVar89;
    local_400._16_8_ = uVar89;
    local_400._24_8_ = uVar89;
    auVar14 = vmovshdup_avx(auVar93);
    uVar89 = auVar14._0_8_;
    local_720._8_8_ = uVar89;
    local_720._0_8_ = uVar89;
    local_720._16_8_ = uVar89;
    local_720._24_8_ = uVar89;
    auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x908);
    local_680._0_4_ = auVar92._0_4_;
    local_680._4_4_ = local_680._0_4_;
    local_680._8_4_ = local_680._0_4_;
    local_680._12_4_ = local_680._0_4_;
    local_680._16_4_ = local_680._0_4_;
    local_680._20_4_ = local_680._0_4_;
    local_680._24_4_ = local_680._0_4_;
    local_680._28_4_ = local_680._0_4_;
    auVar14 = vmovshdup_avx(auVar92);
    uVar89 = auVar14._0_8_;
    local_5c0._8_8_ = uVar89;
    local_5c0._0_8_ = uVar89;
    local_5c0._16_8_ = uVar89;
    local_5c0._24_8_ = uVar89;
    fVar105 = *(float *)*(undefined1 (*) [28])(bezier_basis0 + lVar86 + 0xd8c);
    fVar206 = *(float *)(bezier_basis0 + lVar86 + 0xd90);
    fVar207 = *(float *)(bezier_basis0 + lVar86 + 0xd94);
    fVar208 = *(float *)(bezier_basis0 + lVar86 + 0xd98);
    fVar209 = *(float *)(bezier_basis0 + lVar86 + 0xd9c);
    fVar102 = *(float *)(bezier_basis0 + lVar86 + 0xda0);
    fVar104 = *(float *)(bezier_basis0 + lVar86 + 0xda4);
    auVar76 = *(undefined1 (*) [28])(bezier_basis0 + lVar86 + 0xd8c);
    auVar14 = vmovshdup_avx(auVar126);
    local_580 = auVar14._0_8_;
    local_5a0 = auVar126._0_4_;
    auVar112._0_4_ = fVar105 * local_5a0;
    auVar112._4_4_ = fVar206 * local_5a0;
    auVar112._8_4_ = fVar207 * local_5a0;
    auVar112._12_4_ = fVar208 * local_5a0;
    auVar112._16_4_ = fVar209 * local_5a0;
    auVar112._20_4_ = fVar102 * local_5a0;
    auVar112._24_4_ = fVar104 * local_5a0;
    auVar112._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar112,auVar135,local_680);
    fVar125 = auVar14._0_4_;
    auVar179._0_4_ = fVar105 * fVar125;
    fVar103 = auVar14._4_4_;
    auVar179._4_4_ = fVar206 * fVar103;
    auVar179._8_4_ = fVar207 * fVar125;
    auVar179._12_4_ = fVar208 * fVar103;
    auVar179._16_4_ = fVar209 * fVar125;
    auVar179._20_4_ = fVar102 * fVar103;
    auVar179._28_36_ = auVar204._28_36_;
    auVar179._24_4_ = fVar104 * fVar125;
    auVar14 = vfmadd231ps_fma(auVar179._0_32_,auVar135,local_5c0);
    auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x484);
    uVar78 = auVar93._0_4_;
    local_620._4_4_ = uVar78;
    local_620._0_4_ = uVar78;
    local_620._8_4_ = uVar78;
    local_620._12_4_ = uVar78;
    local_620._16_4_ = uVar78;
    local_620._20_4_ = uVar78;
    local_620._24_4_ = uVar78;
    local_620._28_4_ = uVar78;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,local_620);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar112,local_720);
    auVar8 = *(undefined1 (*) [32])(bezier_basis0 + lVar86);
    uVar78 = auVar18._0_4_;
    local_560._4_4_ = uVar78;
    local_560._0_4_ = uVar78;
    local_560._8_4_ = uVar78;
    local_560._12_4_ = uVar78;
    local_560._16_4_ = uVar78;
    local_560._20_4_ = uVar78;
    local_560._24_4_ = uVar78;
    local_560._28_4_ = uVar78;
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar8,local_560);
    auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar8,local_400);
    auVar100 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x908);
    pauVar2 = (undefined1 (*) [32])(bezier_basis1 + lVar86 + 0xd8c);
    fVar106 = *(float *)*pauVar2;
    fVar107 = *(float *)(bezier_basis1 + lVar86 + 0xd90);
    fVar108 = *(float *)(bezier_basis1 + lVar86 + 0xd94);
    fVar109 = *(float *)(bezier_basis1 + lVar86 + 0xd98);
    fVar71 = *(float *)(bezier_basis1 + lVar86 + 0xd9c);
    fVar189 = *(float *)(bezier_basis1 + lVar86 + 0xda0);
    fVar193 = *(float *)(bezier_basis1 + lVar86 + 0xda4);
    auVar77 = *(undefined1 (*) [28])*pauVar2;
    fStack_59c = local_5a0;
    fStack_598 = local_5a0;
    fStack_594 = local_5a0;
    fStack_590 = local_5a0;
    fStack_58c = local_5a0;
    fStack_588 = local_5a0;
    fStack_584 = local_5a0;
    auVar9._4_4_ = fVar107 * local_5a0;
    auVar9._0_4_ = fVar106 * local_5a0;
    auVar9._8_4_ = fVar108 * local_5a0;
    auVar9._12_4_ = fVar109 * local_5a0;
    auVar9._16_4_ = fVar71 * local_5a0;
    auVar9._20_4_ = fVar189 * local_5a0;
    auVar9._24_4_ = fVar193 * local_5a0;
    auVar9._28_4_ = local_5a0;
    auVar16 = vfmadd231ps_fma(auVar9,auVar100,local_680);
    uStack_578 = local_580;
    uStack_570 = local_580;
    uStack_568 = local_580;
    auVar13._4_4_ = fVar107 * fVar103;
    auVar13._0_4_ = fVar106 * fVar125;
    auVar13._8_4_ = fVar108 * fVar125;
    auVar13._12_4_ = fVar109 * fVar103;
    auVar13._16_4_ = fVar71 * fVar125;
    auVar13._20_4_ = fVar189 * fVar103;
    auVar13._24_4_ = fVar193 * fVar125;
    auVar13._28_4_ = fVar103;
    auVar17 = vfmadd231ps_fma(auVar13,auVar100,local_5c0);
    auVar9 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x484);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar9,local_620);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar9,local_720);
    local_760 = *(undefined1 (*) [32])(bezier_basis1 + lVar86);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),local_760,local_560);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),local_760,local_400);
    local_300 = ZEXT1632(auVar16);
    auVar113 = ZEXT1632(auVar15);
    auVar175 = vsubps_avx(local_300,auVar113);
    local_320 = ZEXT1632(auVar17);
    local_340 = ZEXT1632(auVar14);
    auVar20 = vsubps_avx(local_320,local_340);
    auVar95._0_4_ = auVar14._0_4_ * auVar175._0_4_;
    auVar95._4_4_ = auVar14._4_4_ * auVar175._4_4_;
    auVar95._8_4_ = auVar14._8_4_ * auVar175._8_4_;
    auVar95._12_4_ = auVar14._12_4_ * auVar175._12_4_;
    auVar95._16_4_ = auVar175._16_4_ * 0.0;
    auVar95._20_4_ = auVar175._20_4_ * 0.0;
    auVar95._24_4_ = auVar175._24_4_ * 0.0;
    auVar95._28_4_ = 0;
    fVar171 = auVar20._0_4_;
    auVar114._0_4_ = fVar171 * auVar15._0_4_;
    fVar180 = auVar20._4_4_;
    auVar114._4_4_ = fVar180 * auVar15._4_4_;
    fVar181 = auVar20._8_4_;
    auVar114._8_4_ = fVar181 * auVar15._8_4_;
    fVar182 = auVar20._12_4_;
    auVar114._12_4_ = fVar182 * auVar15._12_4_;
    fVar183 = auVar20._16_4_;
    auVar114._16_4_ = fVar183 * 0.0;
    fVar184 = auVar20._20_4_;
    auVar114._20_4_ = fVar184 * 0.0;
    fVar185 = auVar20._24_4_;
    auVar114._24_4_ = fVar185 * 0.0;
    auVar114._28_4_ = 0;
    auVar95 = vsubps_avx(auVar95,auVar114);
    auVar14 = vpermilps_avx(*(undefined1 (*) [16])pPVar1,0xff);
    uVar89 = auVar14._0_8_;
    local_80._8_8_ = uVar89;
    local_80._0_8_ = uVar89;
    local_80._16_8_ = uVar89;
    local_80._24_8_ = uVar89;
    auVar15 = vpermilps_avx(local_520,0xff);
    uVar89 = auVar15._0_8_;
    local_a0._8_8_ = uVar89;
    local_a0._0_8_ = uVar89;
    local_a0._16_8_ = uVar89;
    local_a0._24_8_ = uVar89;
    auVar15 = vpermilps_avx(local_530,0xff);
    uVar89 = auVar15._0_8_;
    local_c0._8_8_ = uVar89;
    local_c0._0_8_ = uVar89;
    local_c0._16_8_ = uVar89;
    local_c0._24_8_ = uVar89;
    auVar15 = vpermilps_avx(_local_4c0,0xff);
    local_e0 = auVar15._0_8_;
    fVar124 = auVar15._0_4_;
    auVar162._0_4_ = fVar105 * fVar124;
    fVar105 = auVar15._4_4_;
    auVar162._4_4_ = fVar206 * fVar105;
    auVar162._8_4_ = fVar207 * fVar124;
    auVar162._12_4_ = fVar208 * fVar105;
    auVar162._16_4_ = fVar209 * fVar124;
    auVar162._20_4_ = fVar102 * fVar105;
    auVar162._24_4_ = fVar104 * fVar124;
    auVar162._28_4_ = 0;
    auVar15 = vfmadd231ps_fma(auVar162,local_c0,auVar135);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar112,local_a0);
    auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar8,local_80);
    uStack_d8 = local_e0;
    uStack_d0 = local_e0;
    uStack_c8 = local_e0;
    _local_360 = *pauVar2;
    auVar114 = _local_360;
    auVar22._4_4_ = fVar107 * fVar105;
    auVar22._0_4_ = fVar106 * fVar124;
    auVar22._8_4_ = fVar108 * fVar124;
    auVar22._12_4_ = fVar109 * fVar105;
    auVar22._16_4_ = fVar71 * fVar124;
    auVar22._20_4_ = fVar189 * fVar105;
    auVar22._24_4_ = fVar193 * fVar124;
    auVar22._28_4_ = auVar8._28_4_;
    auVar15 = vfmadd231ps_fma(auVar22,auVar100,local_c0);
    auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar9,local_a0);
    auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),local_760,local_80);
    auVar23._4_4_ = fVar180 * fVar180;
    auVar23._0_4_ = fVar171 * fVar171;
    auVar23._8_4_ = fVar181 * fVar181;
    auVar23._12_4_ = fVar182 * fVar182;
    auVar23._16_4_ = fVar183 * fVar183;
    auVar23._20_4_ = fVar184 * fVar184;
    auVar23._24_4_ = fVar185 * fVar185;
    auVar23._28_4_ = auVar14._4_4_;
    auVar14 = vfmadd231ps_fma(auVar23,auVar175,auVar175);
    auVar13 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
    auVar21._4_4_ = auVar14._4_4_ * auVar13._4_4_ * auVar13._4_4_;
    auVar21._0_4_ = auVar14._0_4_ * auVar13._0_4_ * auVar13._0_4_;
    auVar21._8_4_ = auVar14._8_4_ * auVar13._8_4_ * auVar13._8_4_;
    auVar21._12_4_ = auVar14._12_4_ * auVar13._12_4_ * auVar13._12_4_;
    auVar21._16_4_ = auVar13._16_4_ * auVar13._16_4_ * 0.0;
    auVar21._20_4_ = auVar13._20_4_ * auVar13._20_4_ * 0.0;
    auVar21._24_4_ = auVar13._24_4_ * auVar13._24_4_ * 0.0;
    auVar21._28_4_ = auVar13._28_4_;
    auVar25._4_4_ = auVar95._4_4_ * auVar95._4_4_;
    auVar25._0_4_ = auVar95._0_4_ * auVar95._0_4_;
    auVar25._8_4_ = auVar95._8_4_ * auVar95._8_4_;
    auVar25._12_4_ = auVar95._12_4_ * auVar95._12_4_;
    auVar25._16_4_ = auVar95._16_4_ * auVar95._16_4_;
    auVar25._20_4_ = auVar95._20_4_ * auVar95._20_4_;
    auVar25._24_4_ = auVar95._24_4_ * auVar95._24_4_;
    auVar25._28_4_ = auVar95._28_4_;
    auVar13 = vcmpps_avx(auVar25,auVar21,2);
    fVar124 = auVar19._0_4_ * 4.7683716e-07;
    auVar115._0_4_ = (float)iVar11;
    local_3e0._4_12_ = auVar126._4_12_;
    local_3e0._0_4_ = auVar115._0_4_;
    local_3e0._16_16_ = auVar121._16_16_;
    auVar115._4_4_ = auVar115._0_4_;
    auVar115._8_4_ = auVar115._0_4_;
    auVar115._12_4_ = auVar115._0_4_;
    auVar115._16_4_ = auVar115._0_4_;
    auVar115._20_4_ = auVar115._0_4_;
    auVar115._24_4_ = auVar115._0_4_;
    auVar115._28_4_ = auVar115._0_4_;
    auVar121 = vcmpps_avx(_DAT_01f7b060,auVar115,1);
    auVar14 = vpermilps_avx(auVar18,0xaa);
    uVar89 = auVar14._0_8_;
    local_480._8_8_ = uVar89;
    local_480._0_8_ = uVar89;
    local_480._16_8_ = uVar89;
    local_480._24_8_ = uVar89;
    auVar15 = vpermilps_avx(auVar93,0xaa);
    uVar89 = auVar15._0_8_;
    local_2c0._8_8_ = uVar89;
    local_2c0._0_8_ = uVar89;
    local_2c0._16_8_ = uVar89;
    local_2c0._24_8_ = uVar89;
    auVar19 = vpermilps_avx(auVar92,0xaa);
    uVar89 = auVar19._0_8_;
    local_2e0._8_8_ = uVar89;
    local_2e0._0_8_ = uVar89;
    local_2e0._16_8_ = uVar89;
    local_2e0._24_8_ = uVar89;
    auVar19 = vshufps_avx(auVar126,auVar126,0xaa);
    local_4e0 = auVar19._0_8_;
    auVar95 = auVar121 & auVar13;
    local_660._0_16_ = vpermilps_avx((undefined1  [16])aVar5,0xff);
    auVar22 = local_660;
    local_740._0_16_ = ZEXT416((uint)fVar124);
    fVar105 = fVar125;
    fVar206 = fVar103;
    fVar207 = fVar125;
    fVar208 = fVar103;
    fVar209 = fVar125;
    uStack_4d8 = local_4e0;
    uStack_4d0 = local_4e0;
    uStack_4c8 = local_4e0;
    local_660 = auVar22;
    if ((((((((auVar95 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar95 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar95 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar95 >> 0x7f,0) == '\0') &&
          (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar95 >> 0xbf,0) == '\0') &&
        (auVar95 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar95[0x1f]) {
      auVar188 = ZEXT3264(auVar187);
      auVar199 = ZEXT3264(auVar120);
LAB_010f961f:
      auVar204 = ZEXT3264(local_680);
      auVar197 = ZEXT3264(local_640);
      auVar179 = ZEXT3264(local_6a0);
      auVar205 = ZEXT3264(local_5c0);
      pRVar80 = (RTCIntersectArguments *)0x0;
      auVar168 = ZEXT3264(CONCAT428(local_5a0,
                                    CONCAT424(local_5a0,
                                              CONCAT420(local_5a0,
                                                        CONCAT416(local_5a0,
                                                                  CONCAT412(local_5a0,
                                                                            CONCAT48(local_5a0,
                                                                                     CONCAT44(
                                                  local_5a0,local_5a0))))))));
      auVar170 = ZEXT3264(local_620);
      auVar145 = ZEXT3264(local_560);
      local_530 = auVar111;
      local_520 = auVar91;
    }
    else {
      local_380 = vandps_avx(auVar121,auVar13);
      local_360._0_4_ = auVar77._0_4_;
      local_360._4_4_ = auVar77._4_4_;
      fStack_358 = auVar77._8_4_;
      fStack_354 = auVar77._12_4_;
      fStack_350 = auVar77._16_4_;
      fStack_34c = auVar77._20_4_;
      fStack_348 = auVar77._24_4_;
      fVar189 = auVar19._0_4_;
      fVar193 = auVar19._4_4_;
      auVar121._4_4_ = fVar193 * (float)local_360._4_4_;
      auVar121._0_4_ = fVar189 * (float)local_360._0_4_;
      auVar121._8_4_ = fVar189 * fStack_358;
      auVar121._12_4_ = fVar193 * fStack_354;
      auVar121._16_4_ = fVar189 * fStack_350;
      auVar121._20_4_ = fVar193 * fStack_34c;
      auVar121._24_4_ = fVar189 * fStack_348;
      auVar121._28_4_ = local_380._28_4_;
      auVar19 = vfmadd213ps_fma(auVar100,local_2e0,auVar121);
      auVar19 = vfmadd213ps_fma(auVar9,local_2c0,ZEXT1632(auVar19));
      auVar19 = vfmadd213ps_fma(local_760,local_480,ZEXT1632(auVar19));
      local_460._0_4_ = auVar76._0_4_;
      local_460._4_4_ = auVar76._4_4_;
      fStack_458 = auVar76._8_4_;
      fStack_454 = auVar76._12_4_;
      fStack_450 = auVar76._16_4_;
      fStack_44c = auVar76._20_4_;
      fStack_448 = auVar76._24_4_;
      auVar96._0_4_ = fVar189 * (float)local_460._0_4_;
      auVar96._4_4_ = fVar193 * (float)local_460._4_4_;
      auVar96._8_4_ = fVar189 * fStack_458;
      auVar96._12_4_ = fVar193 * fStack_454;
      auVar96._16_4_ = fVar189 * fStack_450;
      auVar96._20_4_ = fVar193 * fStack_44c;
      auVar96._24_4_ = fVar189 * fStack_448;
      auVar96._28_4_ = 0;
      auVar18 = vfmadd213ps_fma(auVar135,local_2e0,auVar96);
      auVar18 = vfmadd213ps_fma(auVar112,local_2c0,ZEXT1632(auVar18));
      auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x1210);
      auVar135 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x1694);
      auVar112 = *(undefined1 (*) [32])(bezier_basis0 + lVar86 + 0x1b18);
      fVar102 = *(float *)(bezier_basis0 + lVar86 + 0x1f9c);
      fVar104 = *(float *)(bezier_basis0 + lVar86 + 0x1fa0);
      fVar106 = *(float *)(bezier_basis0 + lVar86 + 0x1fa4);
      fVar107 = *(float *)(bezier_basis0 + lVar86 + 0x1fa8);
      fVar108 = *(float *)(bezier_basis0 + lVar86 + 0x1fac);
      fVar109 = *(float *)(bezier_basis0 + lVar86 + 0x1fb0);
      fVar71 = *(float *)(bezier_basis0 + lVar86 + 0x1fb4);
      auVar132._0_4_ = local_5a0 * fVar102;
      auVar132._4_4_ = local_5a0 * fVar104;
      auVar132._8_4_ = local_5a0 * fVar106;
      auVar132._12_4_ = local_5a0 * fVar107;
      auVar132._16_4_ = local_5a0 * fVar108;
      auVar132._20_4_ = local_5a0 * fVar109;
      auVar132._24_4_ = local_5a0 * fVar71;
      auVar132._28_4_ = 0;
      _local_460 = auVar175;
      auVar100._4_4_ = fVar103 * fVar104;
      auVar100._0_4_ = fVar125 * fVar102;
      auVar100._8_4_ = fVar125 * fVar106;
      auVar100._12_4_ = fVar103 * fVar107;
      auVar100._16_4_ = fVar125 * fVar108;
      auVar100._20_4_ = fVar103 * fVar109;
      auVar100._24_4_ = fVar125 * fVar71;
      auVar100._28_4_ = auVar175._28_4_;
      auVar26._4_4_ = fVar193 * fVar104;
      auVar26._0_4_ = fVar189 * fVar102;
      auVar26._8_4_ = fVar189 * fVar106;
      auVar26._12_4_ = fVar193 * fVar107;
      auVar26._16_4_ = fVar189 * fVar108;
      auVar26._20_4_ = fVar193 * fVar109;
      auVar26._24_4_ = fVar189 * fVar71;
      auVar26._28_4_ = *(undefined4 *)(bezier_basis0 + lVar86 + 0x1fb8);
      auVar93 = vfmadd231ps_fma(auVar132,auVar112,local_680);
      auVar92 = vfmadd231ps_fma(auVar100,auVar112,local_5c0);
      auVar126 = vfmadd231ps_fma(auVar26,local_2e0,auVar112);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar135,local_620);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar135,local_720);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_2c0,auVar135);
      auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar121,local_560);
      auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar121,local_400);
      auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),local_480,auVar121);
      fVar102 = *(float *)(bezier_basis1 + lVar86 + 0x1f9c);
      fVar104 = *(float *)(bezier_basis1 + lVar86 + 0x1fa0);
      fVar106 = *(float *)(bezier_basis1 + lVar86 + 0x1fa4);
      fVar107 = *(float *)(bezier_basis1 + lVar86 + 0x1fa8);
      fVar108 = *(float *)(bezier_basis1 + lVar86 + 0x1fac);
      fVar109 = *(float *)(bezier_basis1 + lVar86 + 0x1fb0);
      fVar71 = *(float *)(bezier_basis1 + lVar86 + 0x1fb4);
      auVar135._4_4_ = local_5a0 * fVar104;
      auVar135._0_4_ = local_5a0 * fVar102;
      auVar135._8_4_ = local_5a0 * fVar106;
      auVar135._12_4_ = local_5a0 * fVar107;
      auVar135._16_4_ = local_5a0 * fVar108;
      auVar135._20_4_ = local_5a0 * fVar109;
      auVar135._24_4_ = local_5a0 * fVar71;
      auVar135._28_4_ = auVar112._28_4_;
      auVar27._4_4_ = fVar103 * fVar104;
      auVar27._0_4_ = fVar125 * fVar102;
      auVar27._8_4_ = fVar125 * fVar106;
      auVar27._12_4_ = fVar103 * fVar107;
      auVar27._16_4_ = fVar125 * fVar108;
      auVar27._20_4_ = fVar103 * fVar109;
      auVar27._24_4_ = fVar125 * fVar71;
      auVar27._28_4_ = auVar14._4_4_;
      auVar28._4_4_ = fVar193 * fVar104;
      auVar28._0_4_ = fVar189 * fVar102;
      auVar28._8_4_ = fVar189 * fVar106;
      auVar28._12_4_ = fVar193 * fVar107;
      auVar28._16_4_ = fVar189 * fVar108;
      auVar28._20_4_ = fVar193 * fVar109;
      auVar28._24_4_ = fVar189 * fVar71;
      auVar28._28_4_ = fVar103;
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x1b18);
      auVar14 = vfmadd231ps_fma(auVar135,auVar121,local_680);
      auVar127 = vfmadd231ps_fma(auVar27,auVar121,local_5c0);
      auVar139 = vfmadd231ps_fma(auVar28,local_2e0,auVar121);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x1694);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_620);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar121,local_720);
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),local_2c0,auVar121);
      auVar121 = *(undefined1 (*) [32])(bezier_basis1 + lVar86 + 0x1210);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_560);
      auVar127 = vfmadd231ps_fma(ZEXT1632(auVar127),auVar121,local_400);
      auVar116._8_4_ = 0x7fffffff;
      auVar116._0_8_ = 0x7fffffff7fffffff;
      auVar116._12_4_ = 0x7fffffff;
      auVar116._16_4_ = 0x7fffffff;
      auVar116._20_4_ = 0x7fffffff;
      auVar116._24_4_ = 0x7fffffff;
      auVar116._28_4_ = 0x7fffffff;
      auVar139 = vfmadd231ps_fma(ZEXT1632(auVar139),local_480,auVar121);
      auVar121 = vandps_avx(ZEXT1632(auVar93),auVar116);
      auVar135 = vandps_avx(ZEXT1632(auVar92),auVar116);
      auVar135 = vmaxps_avx(auVar121,auVar135);
      auVar121 = vandps_avx(ZEXT1632(auVar126),auVar116);
      auVar121 = vmaxps_avx(auVar135,auVar121);
      auVar174._4_4_ = fVar124;
      auVar174._0_4_ = fVar124;
      auVar174._8_4_ = fVar124;
      auVar174._12_4_ = fVar124;
      auVar174._16_4_ = fVar124;
      auVar174._20_4_ = fVar124;
      auVar174._24_4_ = fVar124;
      auVar174._28_4_ = fVar124;
      auVar121 = vcmpps_avx(auVar121,auVar174,1);
      auVar112 = vblendvps_avx(ZEXT1632(auVar93),auVar175,auVar121);
      auVar100 = vblendvps_avx(ZEXT1632(auVar92),auVar20,auVar121);
      auVar121 = vandps_avx(ZEXT1632(auVar14),auVar116);
      auVar135 = vandps_avx(ZEXT1632(auVar127),auVar116);
      auVar135 = vmaxps_avx(auVar121,auVar135);
      auVar121 = vandps_avx(ZEXT1632(auVar139),auVar116);
      auVar121 = vmaxps_avx(auVar135,auVar121);
      auVar135 = vcmpps_avx(auVar121,auVar174,1);
      auVar121 = vblendvps_avx(ZEXT1632(auVar14),auVar175,auVar135);
      auVar135 = vblendvps_avx(ZEXT1632(auVar127),auVar20,auVar135);
      auVar14 = vfmadd213ps_fma(auVar8,local_480,ZEXT1632(auVar18));
      auVar18 = vfmadd213ps_fma(auVar112,auVar112,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar100,auVar100);
      auVar8 = vrsqrtps_avx(ZEXT1632(auVar18));
      fVar124 = auVar8._0_4_;
      fVar102 = auVar8._4_4_;
      fVar104 = auVar8._8_4_;
      fVar106 = auVar8._12_4_;
      fVar107 = auVar8._16_4_;
      fVar108 = auVar8._20_4_;
      fVar109 = auVar8._24_4_;
      auVar175._4_4_ = fVar102 * fVar102 * fVar102 * auVar18._4_4_ * -0.5;
      auVar175._0_4_ = fVar124 * fVar124 * fVar124 * auVar18._0_4_ * -0.5;
      auVar175._8_4_ = fVar104 * fVar104 * fVar104 * auVar18._8_4_ * -0.5;
      auVar175._12_4_ = fVar106 * fVar106 * fVar106 * auVar18._12_4_ * -0.5;
      auVar175._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
      auVar175._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar175._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar175._28_4_ = 0;
      auVar202._8_4_ = 0x3fc00000;
      auVar202._0_8_ = 0x3fc000003fc00000;
      auVar202._12_4_ = 0x3fc00000;
      auVar202._16_4_ = 0x3fc00000;
      auVar202._20_4_ = 0x3fc00000;
      auVar202._24_4_ = 0x3fc00000;
      auVar202._28_4_ = 0x3fc00000;
      auVar18 = vfmadd231ps_fma(auVar175,auVar202,auVar8);
      fVar124 = auVar18._0_4_;
      fVar102 = auVar18._4_4_;
      auVar20._4_4_ = fVar102 * auVar100._4_4_;
      auVar20._0_4_ = fVar124 * auVar100._0_4_;
      fVar104 = auVar18._8_4_;
      auVar20._8_4_ = fVar104 * auVar100._8_4_;
      fVar106 = auVar18._12_4_;
      auVar20._12_4_ = fVar106 * auVar100._12_4_;
      auVar20._16_4_ = auVar100._16_4_ * 0.0;
      auVar20._20_4_ = auVar100._20_4_ * 0.0;
      auVar20._24_4_ = auVar100._24_4_ * 0.0;
      auVar20._28_4_ = 0;
      auVar29._4_4_ = fVar102 * -auVar112._4_4_;
      auVar29._0_4_ = fVar124 * -auVar112._0_4_;
      auVar29._8_4_ = fVar104 * -auVar112._8_4_;
      auVar29._12_4_ = fVar106 * -auVar112._12_4_;
      auVar29._16_4_ = -auVar112._16_4_ * 0.0;
      auVar29._20_4_ = -auVar112._20_4_ * 0.0;
      auVar29._24_4_ = -auVar112._24_4_ * 0.0;
      auVar29._28_4_ = auVar8._28_4_;
      auVar18 = vfmadd213ps_fma(auVar121,auVar121,ZEXT832(0) << 0x20);
      auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar135,auVar135);
      auVar8 = vrsqrtps_avx(ZEXT1632(auVar18));
      auVar30._28_4_ = auVar15._4_4_;
      auVar30._0_28_ =
           ZEXT1628(CONCAT412(fVar106 * 0.0,
                              CONCAT48(fVar104 * 0.0,CONCAT44(fVar102 * 0.0,fVar124 * 0.0))));
      fVar124 = auVar8._0_4_;
      fVar102 = auVar8._4_4_;
      fVar104 = auVar8._8_4_;
      fVar106 = auVar8._12_4_;
      fVar107 = auVar8._16_4_;
      fVar108 = auVar8._20_4_;
      fVar109 = auVar8._24_4_;
      auVar195._0_4_ = fVar124 * fVar124 * fVar124 * auVar18._0_4_ * -0.5;
      auVar195._4_4_ = fVar102 * fVar102 * fVar102 * auVar18._4_4_ * -0.5;
      auVar195._8_4_ = fVar104 * fVar104 * fVar104 * auVar18._8_4_ * -0.5;
      auVar195._12_4_ = fVar106 * fVar106 * fVar106 * auVar18._12_4_ * -0.5;
      auVar195._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
      auVar195._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
      auVar195._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
      auVar195._28_4_ = 0;
      auVar15 = vfmadd231ps_fma(auVar195,auVar202,auVar8);
      fVar124 = auVar15._0_4_;
      auVar191._0_4_ = auVar135._0_4_ * fVar124;
      fVar102 = auVar15._4_4_;
      auVar191._4_4_ = auVar135._4_4_ * fVar102;
      fVar104 = auVar15._8_4_;
      auVar191._8_4_ = auVar135._8_4_ * fVar104;
      fVar106 = auVar15._12_4_;
      auVar191._12_4_ = auVar135._12_4_ * fVar106;
      auVar191._16_4_ = auVar135._16_4_ * 0.0;
      auVar191._20_4_ = auVar135._20_4_ * 0.0;
      auVar191._24_4_ = auVar135._24_4_ * 0.0;
      auVar191._28_4_ = 0;
      auVar8._4_4_ = fVar102 * -auVar121._4_4_;
      auVar8._0_4_ = fVar124 * -auVar121._0_4_;
      auVar8._8_4_ = fVar104 * -auVar121._8_4_;
      auVar8._12_4_ = fVar106 * -auVar121._12_4_;
      auVar8._16_4_ = -auVar121._16_4_ * 0.0;
      auVar8._20_4_ = -auVar121._20_4_ * 0.0;
      auVar8._24_4_ = -auVar121._24_4_ * 0.0;
      auVar8._28_4_ = auVar112._28_4_ ^ 0x80000000;
      auVar31._28_4_ = 0xbf000000;
      auVar31._0_28_ =
           ZEXT1628(CONCAT412(fVar106 * 0.0,
                              CONCAT48(fVar104 * 0.0,CONCAT44(fVar102 * 0.0,fVar124 * 0.0))));
      auVar15 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar16),auVar113);
      auVar121 = ZEXT1632(auVar16);
      auVar18 = vfmadd213ps_fma(auVar29,auVar121,local_340);
      auVar93 = vfmadd213ps_fma(auVar30,auVar121,ZEXT1632(auVar14));
      auVar127 = vfnmadd213ps_fma(auVar20,auVar121,auVar113);
      auVar92 = vfmadd213ps_fma(auVar191,ZEXT1632(auVar17),local_300);
      auVar139 = vfnmadd213ps_fma(auVar29,auVar121,local_340);
      auVar121 = ZEXT1632(auVar17);
      auVar126 = vfmadd213ps_fma(auVar8,auVar121,local_320);
      local_420 = ZEXT1632(auVar16);
      auVar110 = vfnmadd231ps_fma(ZEXT1632(auVar14),local_420,auVar30);
      auVar14 = vfmadd213ps_fma(auVar31,auVar121,ZEXT1632(auVar19));
      auVar147 = vfnmadd213ps_fma(auVar191,auVar121,local_300);
      auVar90 = vfnmadd213ps_fma(auVar8,auVar121,local_320);
      local_440 = ZEXT1632(auVar17);
      auVar146 = vfnmadd231ps_fma(ZEXT1632(auVar19),local_440,auVar31);
      auVar121 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar139));
      auVar135 = vsubps_avx(ZEXT1632(auVar14),ZEXT1632(auVar110));
      auVar113._4_4_ = auVar110._4_4_ * auVar121._4_4_;
      auVar113._0_4_ = auVar110._0_4_ * auVar121._0_4_;
      auVar113._8_4_ = auVar110._8_4_ * auVar121._8_4_;
      auVar113._12_4_ = auVar110._12_4_ * auVar121._12_4_;
      auVar113._16_4_ = auVar121._16_4_ * 0.0;
      auVar113._20_4_ = auVar121._20_4_ * 0.0;
      auVar113._24_4_ = auVar121._24_4_ * 0.0;
      auVar113._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar113,ZEXT1632(auVar139),auVar135);
      auVar32._4_4_ = auVar135._4_4_ * auVar127._4_4_;
      auVar32._0_4_ = auVar135._0_4_ * auVar127._0_4_;
      auVar32._8_4_ = auVar135._8_4_ * auVar127._8_4_;
      auVar32._12_4_ = auVar135._12_4_ * auVar127._12_4_;
      auVar32._16_4_ = auVar135._16_4_ * 0.0;
      auVar32._20_4_ = auVar135._20_4_ * 0.0;
      auVar32._24_4_ = auVar135._24_4_ * 0.0;
      auVar32._28_4_ = auVar135._28_4_;
      auVar135 = vsubps_avx(ZEXT1632(auVar92),ZEXT1632(auVar127));
      auVar19 = vfmsub231ps_fma(auVar32,ZEXT1632(auVar110),auVar135);
      auVar33._4_4_ = auVar139._4_4_ * auVar135._4_4_;
      auVar33._0_4_ = auVar139._0_4_ * auVar135._0_4_;
      auVar33._8_4_ = auVar139._8_4_ * auVar135._8_4_;
      auVar33._12_4_ = auVar139._12_4_ * auVar135._12_4_;
      auVar33._16_4_ = auVar135._16_4_ * 0.0;
      auVar33._20_4_ = auVar135._20_4_ * 0.0;
      auVar33._24_4_ = auVar135._24_4_ * 0.0;
      auVar33._28_4_ = auVar135._28_4_;
      auVar100 = ZEXT1632(auVar127);
      auVar17 = vfmsub231ps_fma(auVar33,auVar100,auVar121);
      auVar121 = ZEXT1232(ZEXT412(0)) << 0x20;
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar121,ZEXT1632(auVar19));
      auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar121,ZEXT1632(auVar16));
      auVar175 = vcmpps_avx(ZEXT1632(auVar19),ZEXT1232(ZEXT412(0)) << 0x20,2);
      local_760 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar15),auVar175);
      local_780 = vblendvps_avx(ZEXT1632(auVar90),ZEXT1632(auVar18),auVar175);
      auVar121 = vblendvps_avx(ZEXT1632(auVar146),ZEXT1632(auVar93),auVar175);
      auVar135 = vblendvps_avx(auVar100,ZEXT1632(auVar92),auVar175);
      auVar112 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar126),auVar175);
      auVar8 = vblendvps_avx(ZEXT1632(auVar110),ZEXT1632(auVar14),auVar175);
      auVar100 = vblendvps_avx(ZEXT1632(auVar92),auVar100,auVar175);
      auVar9 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar139),auVar175);
      auVar19 = vpackssdw_avx(local_380._0_16_,local_380._16_16_);
      local_7a0 = ZEXT1632(auVar19);
      auVar13 = vblendvps_avx(ZEXT1632(auVar14),ZEXT1632(auVar110),auVar175);
      auVar20 = vsubps_avx(auVar100,local_760);
      auVar9 = vsubps_avx(auVar9,local_780);
      auVar95 = vsubps_avx(auVar13,auVar121);
      auVar22 = vsubps_avx(local_760,auVar135);
      auVar23 = vsubps_avx(local_780,auVar112);
      auVar21 = vsubps_avx(auVar121,auVar8);
      auVar34._4_4_ = auVar95._4_4_ * local_760._4_4_;
      auVar34._0_4_ = auVar95._0_4_ * local_760._0_4_;
      auVar34._8_4_ = auVar95._8_4_ * local_760._8_4_;
      auVar34._12_4_ = auVar95._12_4_ * local_760._12_4_;
      auVar34._16_4_ = auVar95._16_4_ * local_760._16_4_;
      auVar34._20_4_ = auVar95._20_4_ * local_760._20_4_;
      auVar34._24_4_ = auVar95._24_4_ * local_760._24_4_;
      auVar34._28_4_ = auVar13._28_4_;
      auVar14 = vfmsub231ps_fma(auVar34,auVar121,auVar20);
      auVar35._4_4_ = auVar20._4_4_ * local_780._4_4_;
      auVar35._0_4_ = auVar20._0_4_ * local_780._0_4_;
      auVar35._8_4_ = auVar20._8_4_ * local_780._8_4_;
      auVar35._12_4_ = auVar20._12_4_ * local_780._12_4_;
      auVar35._16_4_ = auVar20._16_4_ * local_780._16_4_;
      auVar35._20_4_ = auVar20._20_4_ * local_780._20_4_;
      auVar35._24_4_ = auVar20._24_4_ * local_780._24_4_;
      auVar35._28_4_ = auVar100._28_4_;
      auVar15 = vfmsub231ps_fma(auVar35,local_760,auVar9);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar97._0_4_ = auVar9._0_4_ * auVar121._0_4_;
      auVar97._4_4_ = auVar9._4_4_ * auVar121._4_4_;
      auVar97._8_4_ = auVar9._8_4_ * auVar121._8_4_;
      auVar97._12_4_ = auVar9._12_4_ * auVar121._12_4_;
      auVar97._16_4_ = auVar9._16_4_ * auVar121._16_4_;
      auVar97._20_4_ = auVar9._20_4_ * auVar121._20_4_;
      auVar97._24_4_ = auVar9._24_4_ * auVar121._24_4_;
      auVar97._28_4_ = 0;
      auVar15 = vfmsub231ps_fma(auVar97,local_780,auVar95);
      auVar15 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
      auVar98._0_4_ = auVar21._0_4_ * auVar135._0_4_;
      auVar98._4_4_ = auVar21._4_4_ * auVar135._4_4_;
      auVar98._8_4_ = auVar21._8_4_ * auVar135._8_4_;
      auVar98._12_4_ = auVar21._12_4_ * auVar135._12_4_;
      auVar98._16_4_ = auVar21._16_4_ * auVar135._16_4_;
      auVar98._20_4_ = auVar21._20_4_ * auVar135._20_4_;
      auVar98._24_4_ = auVar21._24_4_ * auVar135._24_4_;
      auVar98._28_4_ = 0;
      auVar14 = vfmsub231ps_fma(auVar98,auVar22,auVar8);
      auVar117._0_4_ = auVar23._0_4_ * auVar8._0_4_;
      auVar117._4_4_ = auVar23._4_4_ * auVar8._4_4_;
      auVar117._8_4_ = auVar23._8_4_ * auVar8._8_4_;
      auVar117._12_4_ = auVar23._12_4_ * auVar8._12_4_;
      auVar117._16_4_ = auVar23._16_4_ * auVar8._16_4_;
      auVar117._20_4_ = auVar23._20_4_ * auVar8._20_4_;
      auVar117._24_4_ = auVar23._24_4_ * auVar8._24_4_;
      auVar117._28_4_ = 0;
      auVar16 = vfmsub231ps_fma(auVar117,auVar112,auVar21);
      auVar36._4_4_ = auVar22._4_4_ * auVar112._4_4_;
      auVar36._0_4_ = auVar22._0_4_ * auVar112._0_4_;
      auVar36._8_4_ = auVar22._8_4_ * auVar112._8_4_;
      auVar36._12_4_ = auVar22._12_4_ * auVar112._12_4_;
      auVar36._16_4_ = auVar22._16_4_ * auVar112._16_4_;
      auVar36._20_4_ = auVar22._20_4_ * auVar112._20_4_;
      auVar36._24_4_ = auVar22._24_4_ * auVar112._24_4_;
      auVar36._28_4_ = auVar112._28_4_;
      auVar17 = vfmsub231ps_fma(auVar36,auVar23,auVar135);
      auVar14 = vfmadd231ps_fma(ZEXT1632(auVar17),ZEXT832(0) << 0x20,ZEXT1632(auVar14));
      auVar16 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
      auVar112 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar16));
      auVar112 = vcmpps_avx(auVar112,ZEXT832(0) << 0x20,2);
      auVar14 = vpackssdw_avx(auVar112._0_16_,auVar112._16_16_);
      auVar19 = vpand_avx(auVar14,auVar19);
      auVar112 = vpmovsxwd_avx2(auVar19);
      if ((((((((auVar112 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar112 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar112 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar112 >> 0x7f,0) == '\0') &&
            (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar112 >> 0xbf,0) == '\0') &&
          (auVar112 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar112[0x1f]) {
LAB_010fa820:
        auVar149._8_8_ = uStack_498;
        auVar149._0_8_ = local_4a0;
        auVar149._16_8_ = uStack_490;
        auVar149._24_8_ = uStack_488;
        auVar188 = ZEXT3264(auVar187);
        auVar199 = ZEXT3264(auVar120);
      }
      else {
        local_7a0 = ZEXT1632(auVar19);
        auVar118._0_4_ = auVar9._0_4_ * auVar21._0_4_;
        auVar118._4_4_ = auVar9._4_4_ * auVar21._4_4_;
        auVar118._8_4_ = auVar9._8_4_ * auVar21._8_4_;
        auVar118._12_4_ = auVar9._12_4_ * auVar21._12_4_;
        auVar118._16_4_ = auVar9._16_4_ * auVar21._16_4_;
        auVar118._20_4_ = auVar9._20_4_ * auVar21._20_4_;
        auVar118._24_4_ = auVar9._24_4_ * auVar21._24_4_;
        auVar118._28_4_ = 0;
        auVar93 = vfmsub231ps_fma(auVar118,auVar23,auVar95);
        auVar37._4_4_ = auVar95._4_4_ * auVar22._4_4_;
        auVar37._0_4_ = auVar95._0_4_ * auVar22._0_4_;
        auVar37._8_4_ = auVar95._8_4_ * auVar22._8_4_;
        auVar37._12_4_ = auVar95._12_4_ * auVar22._12_4_;
        auVar37._16_4_ = auVar95._16_4_ * auVar22._16_4_;
        auVar37._20_4_ = auVar95._20_4_ * auVar22._20_4_;
        auVar37._24_4_ = auVar95._24_4_ * auVar22._24_4_;
        auVar37._28_4_ = auVar135._28_4_;
        auVar18 = vfmsub231ps_fma(auVar37,auVar20,auVar21);
        auVar38._4_4_ = auVar20._4_4_ * auVar23._4_4_;
        auVar38._0_4_ = auVar20._0_4_ * auVar23._0_4_;
        auVar38._8_4_ = auVar20._8_4_ * auVar23._8_4_;
        auVar38._12_4_ = auVar20._12_4_ * auVar23._12_4_;
        auVar38._16_4_ = auVar20._16_4_ * auVar23._16_4_;
        auVar38._20_4_ = auVar20._20_4_ * auVar23._20_4_;
        auVar38._24_4_ = auVar20._24_4_ * auVar23._24_4_;
        auVar38._28_4_ = auVar20._28_4_;
        auVar92 = vfmsub231ps_fma(auVar38,auVar22,auVar9);
        auVar14 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar18),ZEXT1632(auVar92));
        auVar17 = vfmadd231ps_fma(ZEXT1632(auVar14),ZEXT1632(auVar93),ZEXT832(0) << 0x20);
        auVar135 = vrcpps_avx(ZEXT1632(auVar17));
        auVar192._8_4_ = 0x3f800000;
        auVar192._0_8_ = 0x3f8000003f800000;
        auVar192._12_4_ = 0x3f800000;
        auVar192._16_4_ = 0x3f800000;
        auVar192._20_4_ = 0x3f800000;
        auVar192._24_4_ = 0x3f800000;
        auVar192._28_4_ = 0x3f800000;
        auVar14 = vfnmadd213ps_fma(auVar135,ZEXT1632(auVar17),auVar192);
        auVar14 = vfmadd132ps_fma(ZEXT1632(auVar14),auVar135,auVar135);
        auVar39._4_4_ = auVar92._4_4_ * auVar121._4_4_;
        auVar39._0_4_ = auVar92._0_4_ * auVar121._0_4_;
        auVar39._8_4_ = auVar92._8_4_ * auVar121._8_4_;
        auVar39._12_4_ = auVar92._12_4_ * auVar121._12_4_;
        auVar39._16_4_ = auVar121._16_4_ * 0.0;
        auVar39._20_4_ = auVar121._20_4_ * 0.0;
        auVar39._24_4_ = auVar121._24_4_ * 0.0;
        auVar39._28_4_ = auVar121._28_4_;
        auVar18 = vfmadd231ps_fma(auVar39,ZEXT1632(auVar18),local_780);
        auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT1632(auVar93),local_760);
        fVar102 = auVar14._0_4_;
        fVar104 = auVar14._4_4_;
        fVar106 = auVar14._8_4_;
        fVar107 = auVar14._12_4_;
        auVar40._28_4_ = auVar8._28_4_;
        auVar40._0_28_ =
             ZEXT1628(CONCAT412(fVar107 * auVar18._12_4_,
                                CONCAT48(fVar106 * auVar18._8_4_,
                                         CONCAT44(fVar104 * auVar18._4_4_,fVar102 * auVar18._0_4_)))
                     );
        auVar119._8_8_ = local_660._0_8_;
        auVar119._0_8_ = local_660._0_8_;
        auVar119._16_8_ = local_660._0_8_;
        auVar119._24_8_ = local_660._0_8_;
        fVar124 = ray->tfar;
        auVar148._4_4_ = fVar124;
        auVar148._0_4_ = fVar124;
        auVar148._8_4_ = fVar124;
        auVar148._12_4_ = fVar124;
        auVar148._16_4_ = fVar124;
        auVar148._20_4_ = fVar124;
        auVar148._24_4_ = fVar124;
        auVar148._28_4_ = fVar124;
        auVar121 = vcmpps_avx(auVar119,auVar40,2);
        auVar135 = vcmpps_avx(auVar40,auVar148,2);
        auVar121 = vandps_avx(auVar135,auVar121);
        auVar14 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar19 = vpand_avx(auVar14,auVar19);
        auVar121 = vpmovsxwd_avx2(auVar19);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar121 >> 0x7f,0) == '\0') &&
              (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar121 >> 0xbf,0) == '\0') &&
            (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar121[0x1f]) goto LAB_010fa820;
        auVar121 = vcmpps_avx(ZEXT832(0) << 0x20,ZEXT1632(auVar17),4);
        auVar14 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
        auVar19 = vpand_avx(auVar19,auVar14);
        auVar121 = vpmovsxwd_avx2(auVar19);
        auVar149._8_8_ = uStack_498;
        auVar149._0_8_ = local_4a0;
        auVar149._16_8_ = uStack_490;
        auVar149._24_8_ = uStack_488;
        auVar188 = ZEXT3264(auVar187);
        auVar199 = ZEXT3264(auVar120);
        if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0x7f,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar121 >> 0xbf,0) != '\0') ||
            (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar121[0x1f] < '\0') {
          auVar120 = ZEXT1632(CONCAT412(fVar107 * auVar15._12_4_,
                                        CONCAT48(fVar106 * auVar15._8_4_,
                                                 CONCAT44(fVar104 * auVar15._4_4_,
                                                          fVar102 * auVar15._0_4_))));
          auVar135 = ZEXT1632(CONCAT412(fVar107 * auVar16._12_4_,
                                        CONCAT48(fVar106 * auVar16._8_4_,
                                                 CONCAT44(fVar104 * auVar16._4_4_,
                                                          fVar102 * auVar16._0_4_))));
          auVar163._8_4_ = 0x3f800000;
          auVar163._0_8_ = 0x3f8000003f800000;
          auVar163._12_4_ = 0x3f800000;
          auVar163._16_4_ = 0x3f800000;
          auVar163._20_4_ = 0x3f800000;
          auVar163._24_4_ = 0x3f800000;
          auVar163._28_4_ = 0x3f800000;
          auVar187 = vsubps_avx(auVar163,auVar120);
          auVar187 = vblendvps_avx(auVar187,auVar120,auVar175);
          auVar188 = ZEXT3264(auVar187);
          auVar187 = vsubps_avx(auVar163,auVar135);
          local_3a0 = vblendvps_avx(auVar187,auVar135,auVar175);
          auVar199 = ZEXT3264(auVar40);
          auVar149 = auVar121;
        }
      }
      auVar204 = ZEXT3264(local_680);
      auVar197 = ZEXT3264(local_640);
      auVar179 = ZEXT3264(local_6a0);
      auVar205 = ZEXT3264(local_5c0);
      if ((((((((auVar149 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar149 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar149 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar149 >> 0x7f,0) == '\0') &&
            (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar149 >> 0xbf,0) == '\0') &&
          (auVar149 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar149[0x1f]) goto LAB_010f961f;
      auVar121 = vsubps_avx(local_440,local_420);
      local_280 = auVar188._0_32_;
      auVar19 = vfmadd213ps_fma(auVar121,local_280,local_420);
      fVar124 = local_7b8->depth_scale;
      auVar187._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar124;
      auVar187._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar124;
      auVar187._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar124;
      auVar187._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar124;
      auVar187._16_4_ = fVar124 * 0.0;
      auVar187._20_4_ = fVar124 * 0.0;
      auVar187._24_4_ = fVar124 * 0.0;
      auVar187._28_4_ = 0;
      local_240 = auVar199._0_32_;
      auVar121 = vcmpps_avx(local_240,auVar187,6);
      auVar187 = auVar149 & auVar121;
      auVar168 = ZEXT3264(CONCAT428(local_5a0,
                                    CONCAT424(local_5a0,
                                              CONCAT420(local_5a0,
                                                        CONCAT416(local_5a0,
                                                                  CONCAT412(local_5a0,
                                                                            CONCAT48(local_5a0,
                                                                                     CONCAT44(
                                                  local_5a0,local_5a0))))))));
      auVar170 = ZEXT3264(local_620);
      auVar145 = ZEXT3264(local_560);
      if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar187 >> 0x7f,0) == '\0') &&
            (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar187 >> 0xbf,0) == '\0') &&
          (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar187[0x1f]) {
LAB_010f96e0:
        pRVar80 = (RTCIntersectArguments *)0x0;
      }
      else {
        auVar120._8_4_ = 0xbf800000;
        auVar120._0_8_ = 0xbf800000bf800000;
        auVar120._12_4_ = 0xbf800000;
        auVar120._16_4_ = 0xbf800000;
        auVar120._20_4_ = 0xbf800000;
        auVar120._24_4_ = 0xbf800000;
        auVar120._28_4_ = 0xbf800000;
        auVar133._8_4_ = 0x40000000;
        auVar133._0_8_ = 0x4000000040000000;
        auVar133._12_4_ = 0x40000000;
        auVar133._16_4_ = 0x40000000;
        auVar133._20_4_ = 0x40000000;
        auVar133._24_4_ = 0x40000000;
        auVar133._28_4_ = 0x40000000;
        auVar19 = vfmadd213ps_fma(local_3a0,auVar133,auVar120);
        local_260 = ZEXT1632(auVar19);
        local_220 = 0;
        local_21c = iVar11;
        local_210 = *(undefined8 *)pPVar1;
        uStack_208 = *(undefined8 *)(pPVar1 + 8);
        local_200 = local_520._0_8_;
        uStack_1f8 = local_520._8_8_;
        local_1f0 = local_530._0_8_;
        uStack_1e8 = local_530._8_8_;
        local_3a0 = ZEXT1632(auVar19);
        auVar187 = local_3a0;
        if ((pGVar12->mask & ray->mask) == 0) {
          pRVar80 = (RTCIntersectArguments *)0x0;
          auVar145 = ZEXT3264(local_560);
          local_530 = auVar111;
          local_520 = auVar91;
        }
        else {
          pRVar80 = context->args;
          auVar145 = ZEXT3264(local_560);
          if ((pRVar80->filter != (RTCFilterFunctionN)0x0) ||
             (pRVar80 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar80 >> 8),1),
             local_530 = auVar111, local_520 = auVar91,
             pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
            auVar121 = vandps_avx(auVar121,auVar149);
            fVar124 = 1.0 / auVar115._0_4_;
            local_1a0[0] = fVar124 * (auVar188._0_4_ + 0.0);
            local_1a0[1] = fVar124 * (auVar188._4_4_ + 1.0);
            local_1a0[2] = fVar124 * (auVar188._8_4_ + 2.0);
            local_1a0[3] = fVar124 * (auVar188._12_4_ + 3.0);
            fStack_190 = fVar124 * (auVar188._16_4_ + 4.0);
            fStack_18c = fVar124 * (auVar188._20_4_ + 5.0);
            fStack_188 = fVar124 * (auVar188._24_4_ + 6.0);
            fStack_184 = auVar188._28_4_ + 7.0;
            local_3a0._0_8_ = auVar19._0_8_;
            local_3a0._8_8_ = auVar19._8_8_;
            local_180 = local_3a0._0_8_;
            uStack_178 = local_3a0._8_8_;
            uStack_170 = 0;
            uStack_168 = 0;
            local_160 = local_240;
            uVar78 = vmovmskps_avx(auVar121);
            lVar88 = 0;
            uVar81 = CONCAT44((int)((ulong)pRVar80 >> 0x20),uVar78);
            for (uVar82 = uVar81; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
              lVar88 = lVar88 + 1;
            }
            local_6c0 = local_280;
            local_6e0 = local_240;
            local_530 = auVar111;
            local_520 = auVar91;
            local_3a0 = auVar187;
            _local_360 = auVar114;
            while (uVar81 != 0) {
              local_7a0._0_8_ = uVar81;
              local_504 = local_1a0[lVar88];
              local_500 = *(undefined4 *)((long)&local_180 + lVar88 * 4);
              local_780._0_4_ = ray->tfar;
              local_760._0_8_ = lVar88;
              ray->tfar = *(float *)(local_160 + lVar88 * 4);
              local_5f0.context = context->user;
              fVar124 = 1.0 - local_504;
              fVar125 = fVar124 * fVar124 * -3.0;
              auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * fVar124)),
                                        ZEXT416((uint)(local_504 * fVar124)),ZEXT416(0xc0000000));
              auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_504 * fVar124)),
                                        ZEXT416((uint)(local_504 * local_504)),ZEXT416(0x40000000));
              fVar124 = auVar19._0_4_ * 3.0;
              fVar103 = auVar14._0_4_ * 3.0;
              fVar105 = local_504 * local_504 * 3.0;
              auVar155._0_4_ = fVar105 * (float)local_4c0._0_4_;
              auVar155._4_4_ = fVar105 * (float)local_4c0._4_4_;
              auVar155._8_4_ = fVar105 * fStack_4b8;
              auVar155._12_4_ = fVar105 * fStack_4b4;
              auVar128._4_4_ = fVar103;
              auVar128._0_4_ = fVar103;
              auVar128._8_4_ = fVar103;
              auVar128._12_4_ = fVar103;
              auVar19 = vfmadd132ps_fma(auVar128,auVar155,local_530);
              auVar141._4_4_ = fVar124;
              auVar141._0_4_ = fVar124;
              auVar141._8_4_ = fVar124;
              auVar141._12_4_ = fVar124;
              auVar19 = vfmadd132ps_fma(auVar141,auVar19,local_520);
              auVar129._4_4_ = fVar125;
              auVar129._0_4_ = fVar125;
              auVar129._8_4_ = fVar125;
              auVar129._12_4_ = fVar125;
              auVar72._8_8_ = uStack_5f8;
              auVar72._0_8_ = local_600;
              auVar19 = vfmadd132ps_fma(auVar129,auVar19,auVar72);
              local_510 = vmovlps_avx(auVar19);
              local_508 = vextractps_avx(auVar19,2);
              local_4fc = local_7a4;
              local_4f8 = (int)local_6e8;
              local_4f4 = (local_5f0.context)->instID[0];
              local_4f0 = (local_5f0.context)->instPrimID[0];
              local_7c4 = -1;
              local_5f0.valid = &local_7c4;
              local_5f0.geometryUserPtr = pGVar12->userPtr;
              local_5f0.ray = (RTCRayN *)ray;
              local_5f0.hit = (RTCHitN *)&local_510;
              local_5f0.N = 1;
              if ((pGVar12->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                 ((*pGVar12->occlusionFilterN)(&local_5f0), *local_5f0.valid != 0)) {
                p_Var83 = context->args->filter;
                if ((p_Var83 == (RTCFilterFunctionN)0x0) ||
                   ((((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                      RTC_RAY_QUERY_FLAG_INCOHERENT && (((pGVar12->field_8).field_0x2 & 0x40) == 0))
                    || ((*p_Var83)(&local_5f0), p_Var83 = (RTCFilterFunctionN)local_5f0.valid,
                       *local_5f0.valid != 0)))) {
                  pRVar80 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)p_Var83 >> 8),1);
                  auVar197 = ZEXT3264(local_640);
                  auVar179 = ZEXT3264(local_6a0);
                  auVar188 = ZEXT3264(local_6c0);
                  auVar199 = ZEXT3264(local_6e0);
                  auVar204 = ZEXT3264(local_680);
                  auVar205 = ZEXT3264(local_5c0);
                  auVar168 = ZEXT3264(CONCAT428(fStack_584,
                                                CONCAT424(fStack_588,
                                                          CONCAT420(fStack_58c,
                                                                    CONCAT416(fStack_590,
                                                                              CONCAT412(fStack_594,
                                                                                        CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
                  auVar170 = ZEXT3264(local_620);
                  auVar145 = ZEXT3264(local_560);
                  fVar125 = (float)local_580;
                  fVar103 = local_580._4_4_;
                  fVar105 = (float)uStack_578;
                  fVar206 = uStack_578._4_4_;
                  fVar207 = (float)uStack_570;
                  fVar208 = uStack_570._4_4_;
                  fVar209 = (float)uStack_568;
                  uStack_4d8 = uStack_4d8;
                  uStack_4d0 = uStack_4d0;
                  uStack_4c8 = uStack_4c8;
                  goto LAB_010f9643;
                }
              }
              ray->tfar = (float)local_780._0_4_;
              lVar88 = 0;
              uVar81 = local_7a0._0_8_ ^ 1L << (local_760._0_8_ & 0x3f);
              for (uVar82 = uVar81; (uVar82 & 1) == 0; uVar82 = uVar82 >> 1 | 0x8000000000000000) {
                lVar88 = lVar88 + 1;
              }
              auVar197 = ZEXT3264(local_640);
              auVar179 = ZEXT3264(local_6a0);
              auVar188 = ZEXT3264(local_6c0);
              auVar199 = ZEXT3264(local_6e0);
              auVar204 = ZEXT3264(local_680);
              auVar205 = ZEXT3264(local_5c0);
              auVar168 = ZEXT3264(CONCAT428(fStack_584,
                                            CONCAT424(fStack_588,
                                                      CONCAT420(fStack_58c,
                                                                CONCAT416(fStack_590,
                                                                          CONCAT412(fStack_594,
                                                                                    CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
              auVar170 = ZEXT3264(local_620);
              auVar145 = ZEXT3264(local_560);
              fVar125 = (float)local_580;
              fVar103 = local_580._4_4_;
              fVar105 = (float)uStack_578;
              fVar206 = uStack_578._4_4_;
              fVar207 = (float)uStack_570;
              fVar208 = uStack_570._4_4_;
              fVar209 = (float)uStack_568;
            }
            goto LAB_010f96e0;
          }
        }
      }
    }
LAB_010f9643:
    auVar123 = ZEXT3264(local_720);
    auVar137 = ZEXT1664(local_740._0_16_);
    if (8 < iVar11) {
      local_380._4_4_ = iVar11;
      local_380._0_4_ = iVar11;
      local_380._8_4_ = iVar11;
      local_380._12_4_ = iVar11;
      local_380._16_4_ = iVar11;
      local_380._20_4_ = iVar11;
      local_380._24_4_ = iVar11;
      local_380._28_4_ = iVar11;
      local_100 = local_740._0_4_;
      uStack_fc = local_100;
      uStack_f8 = local_100;
      uStack_f4 = local_100;
      uStack_f0 = local_100;
      uStack_ec = local_100;
      uStack_e8 = local_100;
      uStack_e4 = local_100;
      local_120 = local_660._0_8_;
      uStack_118 = local_660._0_8_;
      uStack_110 = local_660._0_8_;
      uStack_108 = local_660._0_8_;
      local_140._0_4_ = 1.0 / (float)local_3e0._0_4_;
      local_140._4_4_ = local_140._0_4_;
      fStack_138 = (float)local_140._0_4_;
      fStack_134 = (float)local_140._0_4_;
      fStack_130 = (float)local_140._0_4_;
      fStack_12c = (float)local_140._0_4_;
      fStack_128 = (float)local_140._0_4_;
      register0x0000121c = local_140._0_4_;
      auVar101 = ZEXT3264(_local_140);
      lVar88 = 8;
      local_6c0 = auVar188._0_32_;
      local_6e0 = auVar199._0_32_;
LAB_010f9b28:
      if (lVar88 < local_7c0) {
        local_760._0_4_ = (int)pRVar80;
        auVar175 = auVar179._0_32_;
        auVar121 = *(undefined1 (*) [32])(bezier_basis0 + lVar88 * 4 + lVar86);
        local_740 = *(undefined1 (*) [32])(lVar86 + 0x21fb768 + lVar88 * 4);
        auVar187 = *(undefined1 (*) [32])(lVar86 + 0x21fbbec + lVar88 * 4);
        pauVar2 = (undefined1 (*) [32])(lVar86 + 0x21fc070 + lVar88 * 4);
        fVar124 = *(float *)*pauVar2;
        fVar102 = *(float *)(*pauVar2 + 4);
        fVar104 = *(float *)(*pauVar2 + 8);
        fVar106 = *(float *)(*pauVar2 + 0xc);
        fVar107 = *(float *)(*pauVar2 + 0x10);
        fVar108 = *(float *)(*pauVar2 + 0x14);
        fVar109 = *(float *)(*pauVar2 + 0x18);
        auVar76 = *(undefined1 (*) [28])*pauVar2;
        auVar188._0_4_ = fVar124 * auVar168._0_4_;
        auVar188._4_4_ = fVar102 * auVar168._4_4_;
        auVar188._8_4_ = fVar104 * auVar168._8_4_;
        auVar188._12_4_ = fVar106 * auVar168._12_4_;
        auVar188._16_4_ = fVar107 * auVar168._16_4_;
        auVar188._20_4_ = fVar108 * auVar168._20_4_;
        auVar188._28_36_ = auVar101._28_36_;
        auVar188._24_4_ = fVar109 * auVar168._24_4_;
        auVar138._0_4_ = fVar124 * fVar125;
        auVar138._4_4_ = fVar102 * fVar103;
        auVar138._8_4_ = fVar104 * fVar105;
        auVar138._12_4_ = fVar106 * fVar206;
        auVar138._16_4_ = fVar107 * fVar207;
        auVar138._20_4_ = fVar108 * fVar208;
        auVar138._28_36_ = auVar137._28_36_;
        auVar138._24_4_ = fVar109 * fVar209;
        auVar19 = vfmadd231ps_fma(auVar188._0_32_,auVar187,auVar204._0_32_);
        auVar14 = vfmadd231ps_fma(auVar138._0_32_,auVar187,auVar205._0_32_);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_740,auVar170._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),local_740,auVar123._0_32_);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),auVar121,auVar145._0_32_);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar121,local_400);
        auVar120 = *(undefined1 (*) [32])(bezier_basis1 + lVar88 * 4 + lVar86);
        auVar135 = *(undefined1 (*) [32])(lVar86 + 0x21fdb88 + lVar88 * 4);
        auVar112 = *(undefined1 (*) [32])(lVar86 + 0x21fe00c + lVar88 * 4);
        pfVar3 = (float *)(lVar86 + 0x21fe490 + lVar88 * 4);
        fVar71 = *pfVar3;
        fVar189 = pfVar3[1];
        fVar193 = pfVar3[2];
        fVar171 = pfVar3[3];
        fVar180 = pfVar3[4];
        fVar181 = pfVar3[5];
        fVar182 = pfVar3[6];
        auVar41._4_4_ = fVar189 * auVar168._4_4_;
        auVar41._0_4_ = fVar71 * auVar168._0_4_;
        auVar41._8_4_ = fVar193 * auVar168._8_4_;
        auVar41._12_4_ = fVar171 * auVar168._12_4_;
        auVar41._16_4_ = fVar180 * auVar168._16_4_;
        auVar41._20_4_ = fVar181 * auVar168._20_4_;
        auVar41._24_4_ = fVar182 * auVar168._24_4_;
        auVar41._28_4_ = auVar121._28_4_;
        auVar137._0_4_ = fVar71 * fVar125;
        auVar137._4_4_ = fVar189 * fVar103;
        auVar137._8_4_ = fVar193 * fVar105;
        auVar137._12_4_ = fVar171 * fVar206;
        auVar137._16_4_ = fVar180 * fVar207;
        auVar137._20_4_ = fVar181 * fVar208;
        auVar137._28_36_ = auVar168._28_36_;
        auVar137._24_4_ = fVar182 * fVar209;
        auVar15 = vfmadd231ps_fma(auVar41,auVar112,auVar204._0_32_);
        auVar16 = vfmadd231ps_fma(auVar137._0_32_,auVar112,auVar205._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar135,auVar170._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar135,auVar123._0_32_);
        auVar15 = vfmadd231ps_fma(ZEXT1632(auVar15),auVar120,auVar145._0_32_);
        auVar16 = vfmadd231ps_fma(ZEXT1632(auVar16),auVar120,local_400);
        local_320 = ZEXT1632(auVar15);
        local_340 = ZEXT1632(auVar19);
        local_440 = vsubps_avx(local_320,local_340);
        local_300 = ZEXT1632(auVar16);
        local_420 = ZEXT1632(auVar14);
        _local_360 = vsubps_avx(local_300,local_420);
        auVar99._0_4_ = auVar14._0_4_ * local_440._0_4_;
        auVar99._4_4_ = auVar14._4_4_ * local_440._4_4_;
        auVar99._8_4_ = auVar14._8_4_ * local_440._8_4_;
        auVar99._12_4_ = auVar14._12_4_ * local_440._12_4_;
        auVar99._16_4_ = local_440._16_4_ * 0.0;
        auVar99._20_4_ = local_440._20_4_ * 0.0;
        auVar99._24_4_ = local_440._24_4_ * 0.0;
        auVar99._28_4_ = 0;
        fVar125 = local_360._0_4_;
        auVar199._0_4_ = fVar125 * auVar19._0_4_;
        fVar103 = local_360._4_4_;
        auVar199._4_4_ = fVar103 * auVar19._4_4_;
        fVar105 = local_360._8_4_;
        auVar199._8_4_ = fVar105 * auVar19._8_4_;
        fVar206 = local_360._12_4_;
        auVar199._12_4_ = fVar206 * auVar19._12_4_;
        fVar207 = local_360._16_4_;
        auVar199._16_4_ = fVar207 * 0.0;
        fVar208 = local_360._20_4_;
        auVar199._20_4_ = fVar208 * 0.0;
        auVar199._28_36_ = auVar123._28_36_;
        fVar209 = local_360._24_4_;
        auVar199._24_4_ = fVar209 * 0.0;
        auVar100 = vsubps_avx(auVar99,auVar199._0_32_);
        _local_460 = *pauVar2;
        auVar13 = _local_460;
        auVar134._0_4_ = fVar124 * (float)local_e0;
        auVar134._4_4_ = fVar102 * local_e0._4_4_;
        auVar134._8_4_ = fVar104 * (float)uStack_d8;
        auVar134._12_4_ = fVar106 * uStack_d8._4_4_;
        auVar134._16_4_ = fVar107 * (float)uStack_d0;
        auVar134._20_4_ = fVar108 * uStack_d0._4_4_;
        auVar134._24_4_ = fVar109 * (float)uStack_c8;
        auVar134._28_4_ = 0;
        auVar19 = vfmadd231ps_fma(auVar134,auVar187,local_c0);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_a0,local_740);
        auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),local_80,auVar121);
        auVar137 = ZEXT1664(auVar19);
        auVar42._4_4_ = fVar189 * local_e0._4_4_;
        auVar42._0_4_ = fVar71 * (float)local_e0;
        auVar42._8_4_ = fVar193 * (float)uStack_d8;
        auVar42._12_4_ = fVar171 * uStack_d8._4_4_;
        auVar42._16_4_ = fVar180 * (float)uStack_d0;
        auVar42._20_4_ = fVar181 * uStack_d0._4_4_;
        auVar42._24_4_ = fVar182 * (float)uStack_c8;
        auVar42._28_4_ = uStack_c8._4_4_;
        auVar14 = vfmadd231ps_fma(auVar42,auVar112,local_c0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar135,local_a0);
        auVar14 = vfmadd231ps_fma(ZEXT1632(auVar14),auVar120,local_80);
        auVar43._4_4_ = fVar103 * fVar103;
        auVar43._0_4_ = fVar125 * fVar125;
        auVar43._8_4_ = fVar105 * fVar105;
        auVar43._12_4_ = fVar206 * fVar206;
        auVar43._16_4_ = fVar207 * fVar207;
        auVar43._20_4_ = fVar208 * fVar208;
        auVar43._24_4_ = fVar209 * fVar209;
        auVar43._28_4_ = local_80._28_4_;
        auVar15 = vfmadd231ps_fma(auVar43,local_440,local_440);
        auVar8 = vmaxps_avx(ZEXT1632(auVar19),ZEXT1632(auVar14));
        auVar176._0_4_ = auVar8._0_4_ * auVar8._0_4_ * auVar15._0_4_;
        auVar176._4_4_ = auVar8._4_4_ * auVar8._4_4_ * auVar15._4_4_;
        auVar176._8_4_ = auVar8._8_4_ * auVar8._8_4_ * auVar15._8_4_;
        auVar176._12_4_ = auVar8._12_4_ * auVar8._12_4_ * auVar15._12_4_;
        auVar176._16_4_ = auVar8._16_4_ * auVar8._16_4_ * 0.0;
        auVar176._20_4_ = auVar8._20_4_ * auVar8._20_4_ * 0.0;
        auVar176._24_4_ = auVar8._24_4_ * auVar8._24_4_ * 0.0;
        auVar176._28_4_ = 0;
        auVar44._4_4_ = auVar100._4_4_ * auVar100._4_4_;
        auVar44._0_4_ = auVar100._0_4_ * auVar100._0_4_;
        auVar44._8_4_ = auVar100._8_4_ * auVar100._8_4_;
        auVar44._12_4_ = auVar100._12_4_ * auVar100._12_4_;
        auVar44._16_4_ = auVar100._16_4_ * auVar100._16_4_;
        auVar44._20_4_ = auVar100._20_4_ * auVar100._20_4_;
        auVar44._24_4_ = auVar100._24_4_ * auVar100._24_4_;
        auVar44._28_4_ = auVar100._28_4_;
        auVar8 = vcmpps_avx(auVar44,auVar176,2);
        local_220 = (int)lVar88;
        auVar177._4_4_ = local_220;
        auVar177._0_4_ = local_220;
        auVar177._8_4_ = local_220;
        auVar177._12_4_ = local_220;
        auVar177._16_4_ = local_220;
        auVar177._20_4_ = local_220;
        auVar177._24_4_ = local_220;
        auVar177._28_4_ = local_220;
        auVar100 = vpor_avx2(auVar177,_DAT_01fb4ba0);
        auVar101 = ZEXT3264(local_380);
        auVar9 = vpcmpgtd_avx2(local_380,auVar100);
        auVar100 = auVar9 & auVar8;
        fVar125 = (float)local_580;
        fVar103 = local_580._4_4_;
        fVar105 = (float)uStack_578;
        fVar206 = uStack_578._4_4_;
        fVar207 = (float)uStack_570;
        fVar208 = uStack_570._4_4_;
        fVar209 = (float)uStack_568;
        if ((((((((auVar100 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar100 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar100 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar100 >> 0x7f,0) != '\0') ||
              (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar100 >> 0xbf,0) != '\0') ||
            (auVar100 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar100[0x1f] < '\0') {
          local_3e0 = vandps_avx(auVar9,auVar8);
          auVar45._4_4_ = local_4e0._4_4_ * fVar189;
          auVar45._0_4_ = (float)local_4e0 * fVar71;
          auVar45._8_4_ = (float)uStack_4d8 * fVar193;
          auVar45._12_4_ = uStack_4d8._4_4_ * fVar171;
          auVar45._16_4_ = (float)uStack_4d0 * fVar180;
          auVar45._20_4_ = uStack_4d0._4_4_ * fVar181;
          auVar45._24_4_ = (float)uStack_4c8 * fVar182;
          auVar45._28_4_ = auVar8._28_4_;
          auVar15 = vfmadd213ps_fma(auVar112,local_2e0,auVar45);
          auVar15 = vfmadd213ps_fma(auVar135,local_2c0,ZEXT1632(auVar15));
          auVar15 = vfmadd132ps_fma(auVar120,ZEXT1632(auVar15),local_480);
          local_460._0_4_ = auVar76._0_4_;
          local_460._4_4_ = auVar76._4_4_;
          fStack_458 = auVar76._8_4_;
          fStack_454 = auVar76._12_4_;
          fStack_450 = auVar76._16_4_;
          fStack_44c = auVar76._20_4_;
          fStack_448 = auVar76._24_4_;
          auVar46._4_4_ = local_4e0._4_4_ * (float)local_460._4_4_;
          auVar46._0_4_ = (float)local_4e0 * (float)local_460._0_4_;
          auVar46._8_4_ = (float)uStack_4d8 * fStack_458;
          auVar46._12_4_ = uStack_4d8._4_4_ * fStack_454;
          auVar46._16_4_ = (float)uStack_4d0 * fStack_450;
          auVar46._20_4_ = uStack_4d0._4_4_ * fStack_44c;
          auVar46._24_4_ = (float)uStack_4c8 * fStack_448;
          auVar46._28_4_ = auVar8._28_4_;
          auVar16 = vfmadd213ps_fma(auVar187,local_2e0,auVar46);
          auVar16 = vfmadd213ps_fma(local_740,local_2c0,ZEXT1632(auVar16));
          auVar187 = *(undefined1 (*) [32])(lVar86 + 0x21fc4f4 + lVar88 * 4);
          auVar120 = *(undefined1 (*) [32])(lVar86 + 0x21fc978 + lVar88 * 4);
          auVar135 = *(undefined1 (*) [32])(lVar86 + 0x21fcdfc + lVar88 * 4);
          pfVar4 = (float *)(lVar86 + 0x21fd280 + lVar88 * 4);
          fVar124 = *pfVar4;
          fVar102 = pfVar4[1];
          fVar104 = pfVar4[2];
          fVar106 = pfVar4[3];
          fVar107 = pfVar4[4];
          fVar108 = pfVar4[5];
          fVar109 = pfVar4[6];
          auVar47._4_4_ = fStack_59c * fVar102;
          auVar47._0_4_ = local_5a0 * fVar124;
          auVar47._8_4_ = fStack_598 * fVar104;
          auVar47._12_4_ = fStack_594 * fVar106;
          auVar47._16_4_ = fStack_590 * fVar107;
          auVar47._20_4_ = fStack_58c * fVar108;
          auVar47._24_4_ = fStack_588 * fVar109;
          auVar47._28_4_ = pfVar3[7];
          auVar204._0_4_ = (float)local_580 * fVar124;
          auVar204._4_4_ = local_580._4_4_ * fVar102;
          auVar204._8_4_ = (float)uStack_578 * fVar104;
          auVar204._12_4_ = uStack_578._4_4_ * fVar106;
          auVar204._16_4_ = (float)uStack_570 * fVar107;
          auVar204._20_4_ = uStack_570._4_4_ * fVar108;
          auVar204._28_36_ = auVar197._28_36_;
          auVar204._24_4_ = (float)uStack_568 * fVar109;
          auVar48._4_4_ = fVar102 * local_4e0._4_4_;
          auVar48._0_4_ = fVar124 * (float)local_4e0;
          auVar48._8_4_ = fVar104 * (float)uStack_4d8;
          auVar48._12_4_ = fVar106 * uStack_4d8._4_4_;
          auVar48._16_4_ = fVar107 * (float)uStack_4d0;
          auVar48._20_4_ = fVar108 * uStack_4d0._4_4_;
          auVar48._24_4_ = fVar109 * (float)uStack_4c8;
          auVar48._28_4_ = pfVar4[7];
          auVar17 = vfmadd231ps_fma(auVar47,auVar135,local_680);
          auVar18 = vfmadd231ps_fma(auVar204._0_32_,auVar135,local_5c0);
          auVar93 = vfmadd231ps_fma(auVar48,local_2e0,auVar135);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar120,local_620);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar120,local_720);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),local_2c0,auVar120);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar187,local_560);
          auVar18 = vfmadd231ps_fma(ZEXT1632(auVar18),auVar187,local_400);
          auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),auVar187,local_480);
          pfVar3 = (float *)(lVar86 + 0x21ff6a0 + lVar88 * 4);
          fVar124 = *pfVar3;
          fVar102 = pfVar3[1];
          fVar104 = pfVar3[2];
          fVar106 = pfVar3[3];
          fVar107 = pfVar3[4];
          fVar108 = pfVar3[5];
          fVar109 = pfVar3[6];
          auVar49._4_4_ = fStack_59c * fVar102;
          auVar49._0_4_ = local_5a0 * fVar124;
          auVar49._8_4_ = fStack_598 * fVar104;
          auVar49._12_4_ = fStack_594 * fVar106;
          auVar49._16_4_ = fStack_590 * fVar107;
          auVar49._20_4_ = fStack_58c * fVar108;
          auVar49._24_4_ = fStack_588 * fVar109;
          auVar49._28_4_ = fStack_584;
          auVar50._4_4_ = local_580._4_4_ * fVar102;
          auVar50._0_4_ = (float)local_580 * fVar124;
          auVar50._8_4_ = (float)uStack_578 * fVar104;
          auVar50._12_4_ = uStack_578._4_4_ * fVar106;
          auVar50._16_4_ = (float)uStack_570 * fVar107;
          auVar50._20_4_ = uStack_570._4_4_ * fVar108;
          auVar50._24_4_ = (float)uStack_568 * fVar109;
          auVar50._28_4_ = uStack_568._4_4_;
          auVar51._4_4_ = fVar102 * local_4e0._4_4_;
          auVar51._0_4_ = fVar124 * (float)local_4e0;
          auVar51._8_4_ = fVar104 * (float)uStack_4d8;
          auVar51._12_4_ = fVar106 * uStack_4d8._4_4_;
          auVar51._16_4_ = fVar107 * (float)uStack_4d0;
          auVar51._20_4_ = fVar108 * uStack_4d0._4_4_;
          auVar51._24_4_ = fVar109 * (float)uStack_4c8;
          auVar51._28_4_ = pfVar3[7];
          auVar187 = *(undefined1 (*) [32])(lVar86 + 0x21ff21c + lVar88 * 4);
          auVar92 = vfmadd231ps_fma(auVar49,auVar187,local_680);
          auVar126 = vfmadd231ps_fma(auVar50,auVar187,local_5c0);
          auVar111 = vfmadd231ps_fma(auVar51,local_2e0,auVar187);
          auVar187 = *(undefined1 (*) [32])(lVar86 + 0x21fed98 + lVar88 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar187,local_620);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar187,local_720);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_2c0,auVar187);
          auVar187 = *(undefined1 (*) [32])(lVar86 + 0x21fe914 + lVar88 * 4);
          auVar92 = vfmadd231ps_fma(ZEXT1632(auVar92),auVar187,local_560);
          auVar126 = vfmadd231ps_fma(ZEXT1632(auVar126),auVar187,local_400);
          auVar111 = vfmadd231ps_fma(ZEXT1632(auVar111),local_480,auVar187);
          auVar178._8_4_ = 0x7fffffff;
          auVar178._0_8_ = 0x7fffffff7fffffff;
          auVar178._12_4_ = 0x7fffffff;
          auVar178._16_4_ = 0x7fffffff;
          auVar178._20_4_ = 0x7fffffff;
          auVar178._24_4_ = 0x7fffffff;
          auVar178._28_4_ = 0x7fffffff;
          auVar187 = vandps_avx(ZEXT1632(auVar17),auVar178);
          auVar120 = vandps_avx(ZEXT1632(auVar18),auVar178);
          auVar120 = vmaxps_avx(auVar187,auVar120);
          auVar187 = vandps_avx(ZEXT1632(auVar93),auVar178);
          auVar187 = vmaxps_avx(auVar120,auVar187);
          auVar75._4_4_ = uStack_fc;
          auVar75._0_4_ = local_100;
          auVar75._8_4_ = uStack_f8;
          auVar75._12_4_ = uStack_f4;
          auVar75._16_4_ = uStack_f0;
          auVar75._20_4_ = uStack_ec;
          auVar75._24_4_ = uStack_e8;
          auVar75._28_4_ = uStack_e4;
          auVar187 = vcmpps_avx(auVar187,auVar75,1);
          auVar135 = vblendvps_avx(ZEXT1632(auVar17),local_440,auVar187);
          auVar112 = vblendvps_avx(ZEXT1632(auVar18),_local_360,auVar187);
          auVar187 = vandps_avx(ZEXT1632(auVar92),auVar178);
          auVar120 = vandps_avx(ZEXT1632(auVar126),auVar178);
          auVar120 = vmaxps_avx(auVar187,auVar120);
          auVar187 = vandps_avx(auVar178,ZEXT1632(auVar111));
          auVar187 = vmaxps_avx(auVar120,auVar187);
          auVar120 = vcmpps_avx(auVar187,auVar75,1);
          auVar187 = vblendvps_avx(ZEXT1632(auVar92),local_440,auVar120);
          auVar120 = vblendvps_avx(ZEXT1632(auVar126),_local_360,auVar120);
          auVar16 = vfmadd213ps_fma(auVar121,local_480,ZEXT1632(auVar16));
          auVar17 = vfmadd213ps_fma(auVar135,auVar135,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar112,auVar112);
          auVar121 = vrsqrtps_avx(ZEXT1632(auVar17));
          fVar124 = auVar121._0_4_;
          fVar102 = auVar121._4_4_;
          fVar104 = auVar121._8_4_;
          fVar106 = auVar121._12_4_;
          fVar107 = auVar121._16_4_;
          fVar108 = auVar121._20_4_;
          fVar109 = auVar121._24_4_;
          auVar52._4_4_ = fVar102 * fVar102 * fVar102 * auVar17._4_4_ * -0.5;
          auVar52._0_4_ = fVar124 * fVar124 * fVar124 * auVar17._0_4_ * -0.5;
          auVar52._8_4_ = fVar104 * fVar104 * fVar104 * auVar17._8_4_ * -0.5;
          auVar52._12_4_ = fVar106 * fVar106 * fVar106 * auVar17._12_4_ * -0.5;
          auVar52._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
          auVar52._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar52._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar52._28_4_ = 0;
          auVar203._8_4_ = 0x3fc00000;
          auVar203._0_8_ = 0x3fc000003fc00000;
          auVar203._12_4_ = 0x3fc00000;
          auVar203._16_4_ = 0x3fc00000;
          auVar203._20_4_ = 0x3fc00000;
          auVar203._24_4_ = 0x3fc00000;
          auVar203._28_4_ = 0x3fc00000;
          auVar17 = vfmadd231ps_fma(auVar52,auVar203,auVar121);
          fVar124 = auVar17._0_4_;
          fVar102 = auVar17._4_4_;
          auVar53._4_4_ = auVar112._4_4_ * fVar102;
          auVar53._0_4_ = auVar112._0_4_ * fVar124;
          fVar104 = auVar17._8_4_;
          auVar53._8_4_ = auVar112._8_4_ * fVar104;
          fVar106 = auVar17._12_4_;
          auVar53._12_4_ = auVar112._12_4_ * fVar106;
          auVar53._16_4_ = auVar112._16_4_ * 0.0;
          auVar53._20_4_ = auVar112._20_4_ * 0.0;
          auVar53._24_4_ = auVar112._24_4_ * 0.0;
          auVar53._28_4_ = auVar121._28_4_;
          auVar54._4_4_ = fVar102 * -auVar135._4_4_;
          auVar54._0_4_ = fVar124 * -auVar135._0_4_;
          auVar54._8_4_ = fVar104 * -auVar135._8_4_;
          auVar54._12_4_ = fVar106 * -auVar135._12_4_;
          auVar54._16_4_ = -auVar135._16_4_ * 0.0;
          auVar54._20_4_ = -auVar135._20_4_ * 0.0;
          auVar54._24_4_ = -auVar135._24_4_ * 0.0;
          auVar54._28_4_ = auVar112._28_4_;
          auVar17 = vfmadd213ps_fma(auVar187,auVar187,ZEXT832(0) << 0x20);
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar17),auVar120,auVar120);
          auVar121 = vrsqrtps_avx(ZEXT1632(auVar17));
          auVar55._28_4_ = local_400._28_4_;
          auVar55._0_28_ =
               ZEXT1628(CONCAT412(fVar106 * 0.0,
                                  CONCAT48(fVar104 * 0.0,CONCAT44(fVar102 * 0.0,fVar124 * 0.0))));
          fVar124 = auVar121._0_4_;
          fVar102 = auVar121._4_4_;
          fVar104 = auVar121._8_4_;
          fVar106 = auVar121._12_4_;
          fVar107 = auVar121._16_4_;
          fVar108 = auVar121._20_4_;
          fVar109 = auVar121._24_4_;
          auVar56._4_4_ = fVar102 * fVar102 * fVar102 * auVar17._4_4_ * -0.5;
          auVar56._0_4_ = fVar124 * fVar124 * fVar124 * auVar17._0_4_ * -0.5;
          auVar56._8_4_ = fVar104 * fVar104 * fVar104 * auVar17._8_4_ * -0.5;
          auVar56._12_4_ = fVar106 * fVar106 * fVar106 * auVar17._12_4_ * -0.5;
          auVar56._16_4_ = fVar107 * fVar107 * fVar107 * -0.0;
          auVar56._20_4_ = fVar108 * fVar108 * fVar108 * -0.0;
          auVar56._24_4_ = fVar109 * fVar109 * fVar109 * -0.0;
          auVar56._28_4_ = 0;
          auVar17 = vfmadd231ps_fma(auVar56,auVar203,auVar121);
          fVar124 = auVar17._0_4_;
          fVar102 = auVar17._4_4_;
          auVar57._4_4_ = auVar120._4_4_ * fVar102;
          auVar57._0_4_ = auVar120._0_4_ * fVar124;
          fVar104 = auVar17._8_4_;
          auVar57._8_4_ = auVar120._8_4_ * fVar104;
          fVar106 = auVar17._12_4_;
          auVar57._12_4_ = auVar120._12_4_ * fVar106;
          auVar57._16_4_ = auVar120._16_4_ * 0.0;
          auVar57._20_4_ = auVar120._20_4_ * 0.0;
          auVar57._24_4_ = auVar120._24_4_ * 0.0;
          auVar57._28_4_ = 0;
          auVar58._4_4_ = fVar102 * -auVar187._4_4_;
          auVar58._0_4_ = fVar124 * -auVar187._0_4_;
          auVar58._8_4_ = fVar104 * -auVar187._8_4_;
          auVar58._12_4_ = fVar106 * -auVar187._12_4_;
          auVar58._16_4_ = -auVar187._16_4_ * 0.0;
          auVar58._20_4_ = -auVar187._20_4_ * 0.0;
          auVar58._24_4_ = -auVar187._24_4_ * 0.0;
          auVar58._28_4_ = auVar121._28_4_;
          auVar59._28_4_ = 0xbf000000;
          auVar59._0_28_ =
               ZEXT1628(CONCAT412(fVar106 * 0.0,
                                  CONCAT48(fVar104 * 0.0,CONCAT44(fVar102 * 0.0,fVar124 * 0.0))));
          auVar17 = vfmadd213ps_fma(auVar53,ZEXT1632(auVar19),local_340);
          auVar121 = ZEXT1632(auVar19);
          auVar18 = vfmadd213ps_fma(auVar54,auVar121,local_420);
          auVar93 = vfmadd213ps_fma(auVar55,auVar121,ZEXT1632(auVar16));
          auVar111 = vfnmadd213ps_fma(auVar53,auVar121,local_340);
          auVar92 = vfmadd213ps_fma(auVar57,ZEXT1632(auVar14),local_320);
          auVar91 = vfnmadd213ps_fma(auVar54,auVar121,local_420);
          auVar121 = ZEXT1632(auVar14);
          auVar126 = vfmadd213ps_fma(auVar58,auVar121,local_300);
          local_740 = ZEXT1632(auVar19);
          auVar19 = vfnmadd231ps_fma(ZEXT1632(auVar16),local_740,auVar55);
          auVar16 = vfmadd213ps_fma(auVar59,auVar121,ZEXT1632(auVar15));
          auVar127 = vfnmadd213ps_fma(auVar57,auVar121,local_320);
          auVar139 = vfnmadd213ps_fma(auVar58,auVar121,local_300);
          auVar147 = vfnmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar14),auVar59);
          auVar121 = vsubps_avx(ZEXT1632(auVar126),ZEXT1632(auVar91));
          auVar187 = vsubps_avx(ZEXT1632(auVar16),ZEXT1632(auVar19));
          auVar60._4_4_ = auVar121._4_4_ * auVar19._4_4_;
          auVar60._0_4_ = auVar121._0_4_ * auVar19._0_4_;
          auVar60._8_4_ = auVar121._8_4_ * auVar19._8_4_;
          auVar60._12_4_ = auVar121._12_4_ * auVar19._12_4_;
          auVar60._16_4_ = auVar121._16_4_ * 0.0;
          auVar60._20_4_ = auVar121._20_4_ * 0.0;
          auVar60._24_4_ = auVar121._24_4_ * 0.0;
          auVar60._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar60,ZEXT1632(auVar91),auVar187);
          auVar61._4_4_ = auVar111._4_4_ * auVar187._4_4_;
          auVar61._0_4_ = auVar111._0_4_ * auVar187._0_4_;
          auVar61._8_4_ = auVar111._8_4_ * auVar187._8_4_;
          auVar61._12_4_ = auVar111._12_4_ * auVar187._12_4_;
          auVar61._16_4_ = auVar187._16_4_ * 0.0;
          auVar61._20_4_ = auVar187._20_4_ * 0.0;
          auVar61._24_4_ = auVar187._24_4_ * 0.0;
          auVar61._28_4_ = auVar187._28_4_;
          auVar112 = ZEXT1632(auVar111);
          auVar187 = vsubps_avx(ZEXT1632(auVar92),auVar112);
          auVar100 = ZEXT1632(auVar19);
          auVar19 = vfmsub231ps_fma(auVar61,auVar100,auVar187);
          auVar62._4_4_ = auVar91._4_4_ * auVar187._4_4_;
          auVar62._0_4_ = auVar91._0_4_ * auVar187._0_4_;
          auVar62._8_4_ = auVar91._8_4_ * auVar187._8_4_;
          auVar62._12_4_ = auVar91._12_4_ * auVar187._12_4_;
          auVar62._16_4_ = auVar187._16_4_ * 0.0;
          auVar62._20_4_ = auVar187._20_4_ * 0.0;
          auVar62._24_4_ = auVar187._24_4_ * 0.0;
          auVar62._28_4_ = auVar187._28_4_;
          auVar111 = vfmsub231ps_fma(auVar62,auVar112,auVar121);
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar111),ZEXT832(0) << 0x20,ZEXT1632(auVar19));
          auVar19 = vfmadd231ps_fma(ZEXT1632(auVar19),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar9 = vcmpps_avx(ZEXT1632(auVar19),ZEXT832(0) << 0x20,2);
          local_780 = vblendvps_avx(ZEXT1632(auVar127),ZEXT1632(auVar17),auVar9);
          local_660 = vblendvps_avx(ZEXT1632(auVar139),ZEXT1632(auVar18),auVar9);
          auVar121 = vblendvps_avx(ZEXT1632(auVar147),ZEXT1632(auVar93),auVar9);
          auVar187 = vblendvps_avx(auVar112,ZEXT1632(auVar92),auVar9);
          auVar120 = vblendvps_avx(ZEXT1632(auVar91),ZEXT1632(auVar126),auVar9);
          auVar135 = vblendvps_avx(auVar100,ZEXT1632(auVar16),auVar9);
          auVar112 = vblendvps_avx(ZEXT1632(auVar92),auVar112,auVar9);
          auVar8 = vblendvps_avx(ZEXT1632(auVar126),ZEXT1632(auVar91),auVar9);
          auVar19 = vpackssdw_avx(local_3e0._0_16_,local_3e0._16_16_);
          local_7a0 = ZEXT1632(auVar19);
          auVar100 = vblendvps_avx(ZEXT1632(auVar16),auVar100,auVar9);
          auVar112 = vsubps_avx(auVar112,local_780);
          auVar8 = vsubps_avx(auVar8,local_660);
          auVar20 = vsubps_avx(auVar100,auVar121);
          auVar95 = vsubps_avx(local_780,auVar187);
          auVar22 = vsubps_avx(local_660,auVar120);
          auVar23 = vsubps_avx(auVar121,auVar135);
          auVar157._0_4_ = auVar20._0_4_ * local_780._0_4_;
          auVar157._4_4_ = auVar20._4_4_ * local_780._4_4_;
          auVar157._8_4_ = auVar20._8_4_ * local_780._8_4_;
          auVar157._12_4_ = auVar20._12_4_ * local_780._12_4_;
          auVar157._16_4_ = auVar20._16_4_ * local_780._16_4_;
          auVar157._20_4_ = auVar20._20_4_ * local_780._20_4_;
          auVar157._24_4_ = auVar20._24_4_ * local_780._24_4_;
          auVar157._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar157,auVar121,auVar112);
          auVar63._4_4_ = auVar112._4_4_ * local_660._4_4_;
          auVar63._0_4_ = auVar112._0_4_ * local_660._0_4_;
          auVar63._8_4_ = auVar112._8_4_ * local_660._8_4_;
          auVar63._12_4_ = auVar112._12_4_ * local_660._12_4_;
          auVar63._16_4_ = auVar112._16_4_ * local_660._16_4_;
          auVar63._20_4_ = auVar112._20_4_ * local_660._20_4_;
          auVar63._24_4_ = auVar112._24_4_ * local_660._24_4_;
          auVar63._28_4_ = auVar100._28_4_;
          auVar16 = vfmsub231ps_fma(auVar63,local_780,auVar8);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar16),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar158._0_4_ = auVar8._0_4_ * auVar121._0_4_;
          auVar158._4_4_ = auVar8._4_4_ * auVar121._4_4_;
          auVar158._8_4_ = auVar8._8_4_ * auVar121._8_4_;
          auVar158._12_4_ = auVar8._12_4_ * auVar121._12_4_;
          auVar158._16_4_ = auVar8._16_4_ * auVar121._16_4_;
          auVar158._20_4_ = auVar8._20_4_ * auVar121._20_4_;
          auVar158._24_4_ = auVar8._24_4_ * auVar121._24_4_;
          auVar158._28_4_ = 0;
          auVar16 = vfmsub231ps_fma(auVar158,local_660,auVar20);
          auVar16 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar16));
          auVar137 = ZEXT1664(auVar16);
          auVar159._0_4_ = auVar23._0_4_ * auVar187._0_4_;
          auVar159._4_4_ = auVar23._4_4_ * auVar187._4_4_;
          auVar159._8_4_ = auVar23._8_4_ * auVar187._8_4_;
          auVar159._12_4_ = auVar23._12_4_ * auVar187._12_4_;
          auVar159._16_4_ = auVar23._16_4_ * auVar187._16_4_;
          auVar159._20_4_ = auVar23._20_4_ * auVar187._20_4_;
          auVar159._24_4_ = auVar23._24_4_ * auVar187._24_4_;
          auVar159._28_4_ = 0;
          auVar15 = vfmsub231ps_fma(auVar159,auVar95,auVar135);
          auVar64._4_4_ = auVar22._4_4_ * auVar135._4_4_;
          auVar64._0_4_ = auVar22._0_4_ * auVar135._0_4_;
          auVar64._8_4_ = auVar22._8_4_ * auVar135._8_4_;
          auVar64._12_4_ = auVar22._12_4_ * auVar135._12_4_;
          auVar64._16_4_ = auVar22._16_4_ * auVar135._16_4_;
          auVar64._20_4_ = auVar22._20_4_ * auVar135._20_4_;
          auVar64._24_4_ = auVar22._24_4_ * auVar135._24_4_;
          auVar64._28_4_ = auVar135._28_4_;
          auVar17 = vfmsub231ps_fma(auVar64,auVar120,auVar23);
          auVar65._4_4_ = auVar95._4_4_ * auVar120._4_4_;
          auVar65._0_4_ = auVar95._0_4_ * auVar120._0_4_;
          auVar65._8_4_ = auVar95._8_4_ * auVar120._8_4_;
          auVar65._12_4_ = auVar95._12_4_ * auVar120._12_4_;
          auVar65._16_4_ = auVar95._16_4_ * auVar120._16_4_;
          auVar65._20_4_ = auVar95._20_4_ * auVar120._20_4_;
          auVar65._24_4_ = auVar95._24_4_ * auVar120._24_4_;
          auVar65._28_4_ = auVar120._28_4_;
          auVar18 = vfmsub231ps_fma(auVar65,auVar22,auVar187);
          auVar15 = vfmadd231ps_fma(ZEXT1632(auVar18),ZEXT832(0) << 0x20,ZEXT1632(auVar15));
          auVar17 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT832(0) << 0x20,ZEXT1632(auVar17));
          auVar187 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(auVar17));
          auVar187 = vcmpps_avx(auVar187,ZEXT832(0) << 0x20,2);
          auVar15 = vpackssdw_avx(auVar187._0_16_,auVar187._16_16_);
          auVar19 = vpand_avx(auVar15,auVar19);
          auVar187 = vpmovsxwd_avx2(auVar19);
          if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar187 >> 0x7f,0) == '\0') &&
                (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar187 >> 0xbf,0) == '\0') &&
              (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar187[0x1f]) {
LAB_010fa749:
            auVar144._8_8_ = uStack_498;
            auVar144._0_8_ = local_4a0;
            auVar144._16_8_ = uStack_490;
            auVar144._24_8_ = uStack_488;
            auVar197 = ZEXT3264(auVar197._0_32_);
            auVar179 = ZEXT3264(auVar175);
          }
          else {
            auVar66._4_4_ = auVar8._4_4_ * auVar23._4_4_;
            auVar66._0_4_ = auVar8._0_4_ * auVar23._0_4_;
            auVar66._8_4_ = auVar8._8_4_ * auVar23._8_4_;
            auVar66._12_4_ = auVar8._12_4_ * auVar23._12_4_;
            auVar66._16_4_ = auVar8._16_4_ * auVar23._16_4_;
            auVar66._20_4_ = auVar8._20_4_ * auVar23._20_4_;
            auVar66._24_4_ = auVar8._24_4_ * auVar23._24_4_;
            auVar66._28_4_ = auVar187._28_4_;
            auVar92 = vfmsub231ps_fma(auVar66,auVar22,auVar20);
            auVar164._0_4_ = auVar95._0_4_ * auVar20._0_4_;
            auVar164._4_4_ = auVar95._4_4_ * auVar20._4_4_;
            auVar164._8_4_ = auVar95._8_4_ * auVar20._8_4_;
            auVar164._12_4_ = auVar95._12_4_ * auVar20._12_4_;
            auVar164._16_4_ = auVar95._16_4_ * auVar20._16_4_;
            auVar164._20_4_ = auVar95._20_4_ * auVar20._20_4_;
            auVar164._24_4_ = auVar95._24_4_ * auVar20._24_4_;
            auVar164._28_4_ = 0;
            auVar93 = vfmsub231ps_fma(auVar164,auVar112,auVar23);
            auVar67._4_4_ = auVar112._4_4_ * auVar22._4_4_;
            auVar67._0_4_ = auVar112._0_4_ * auVar22._0_4_;
            auVar67._8_4_ = auVar112._8_4_ * auVar22._8_4_;
            auVar67._12_4_ = auVar112._12_4_ * auVar22._12_4_;
            auVar67._16_4_ = auVar112._16_4_ * auVar22._16_4_;
            auVar67._20_4_ = auVar112._20_4_ * auVar22._20_4_;
            auVar67._24_4_ = auVar112._24_4_ * auVar22._24_4_;
            auVar67._28_4_ = auVar22._28_4_;
            auVar126 = vfmsub231ps_fma(auVar67,auVar95,auVar8);
            auVar15 = vfmadd213ps_fma(ZEXT832(0) << 0x20,ZEXT1632(auVar93),ZEXT1632(auVar126));
            auVar18 = vfmadd231ps_fma(ZEXT1632(auVar15),ZEXT1632(auVar92),ZEXT832(0) << 0x20);
            auVar187 = vrcpps_avx(ZEXT1632(auVar18));
            auVar196._8_4_ = 0x3f800000;
            auVar196._0_8_ = 0x3f8000003f800000;
            auVar196._12_4_ = 0x3f800000;
            auVar196._16_4_ = 0x3f800000;
            auVar196._20_4_ = 0x3f800000;
            auVar196._24_4_ = 0x3f800000;
            auVar196._28_4_ = 0x3f800000;
            auVar15 = vfnmadd213ps_fma(auVar187,ZEXT1632(auVar18),auVar196);
            auVar15 = vfmadd132ps_fma(ZEXT1632(auVar15),auVar187,auVar187);
            auVar68._4_4_ = auVar126._4_4_ * auVar121._4_4_;
            auVar68._0_4_ = auVar126._0_4_ * auVar121._0_4_;
            auVar68._8_4_ = auVar126._8_4_ * auVar121._8_4_;
            auVar68._12_4_ = auVar126._12_4_ * auVar121._12_4_;
            auVar68._16_4_ = auVar121._16_4_ * 0.0;
            auVar68._20_4_ = auVar121._20_4_ * 0.0;
            auVar68._24_4_ = auVar121._24_4_ * 0.0;
            auVar68._28_4_ = auVar121._28_4_;
            auVar93 = vfmadd231ps_fma(auVar68,ZEXT1632(auVar93),local_660);
            auVar93 = vfmadd231ps_fma(ZEXT1632(auVar93),ZEXT1632(auVar92),local_780);
            fVar102 = auVar15._0_4_;
            fVar104 = auVar15._4_4_;
            fVar106 = auVar15._8_4_;
            fVar107 = auVar15._12_4_;
            auVar120 = ZEXT1632(CONCAT412(fVar107 * auVar93._12_4_,
                                          CONCAT48(fVar106 * auVar93._8_4_,
                                                   CONCAT44(fVar104 * auVar93._4_4_,
                                                            fVar102 * auVar93._0_4_))));
            fVar124 = ray->tfar;
            auVar143._4_4_ = fVar124;
            auVar143._0_4_ = fVar124;
            auVar143._8_4_ = fVar124;
            auVar143._12_4_ = fVar124;
            auVar143._16_4_ = fVar124;
            auVar143._20_4_ = fVar124;
            auVar143._24_4_ = fVar124;
            auVar143._28_4_ = fVar124;
            auVar74._8_8_ = uStack_118;
            auVar74._0_8_ = local_120;
            auVar74._16_8_ = uStack_110;
            auVar74._24_8_ = uStack_108;
            auVar121 = vcmpps_avx(auVar74,auVar120,2);
            auVar187 = vcmpps_avx(auVar120,auVar143,2);
            auVar121 = vandps_avx(auVar187,auVar121);
            auVar15 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
            auVar19 = vpand_avx(auVar19,auVar15);
            auVar121 = vpmovsxwd_avx2(auVar19);
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                   SUB321(auVar121 >> 0x7f,0) == '\0') &&
                  (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                 SUB321(auVar121 >> 0xbf,0) == '\0') &&
                (auVar121 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                -1 < auVar121[0x1f]) goto LAB_010fa749;
            auVar121 = vcmpps_avx(ZEXT1632(auVar18),ZEXT832(0) << 0x20,4);
            auVar15 = vpackssdw_avx(auVar121._0_16_,auVar121._16_16_);
            auVar19 = vpand_avx(auVar19,auVar15);
            auVar121 = vpmovsxwd_avx2(auVar19);
            auVar144._8_8_ = uStack_498;
            auVar144._0_8_ = local_4a0;
            auVar144._16_8_ = uStack_490;
            auVar144._24_8_ = uStack_488;
            auVar197 = ZEXT3264(auVar197._0_32_);
            auVar179 = ZEXT3264(auVar175);
            if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar121 >> 0x7f,0) != '\0') ||
                  (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0xbf,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar121[0x1f] < '\0') {
              auVar135 = ZEXT1632(CONCAT412(fVar107 * auVar16._12_4_,
                                            CONCAT48(fVar106 * auVar16._8_4_,
                                                     CONCAT44(fVar104 * auVar16._4_4_,
                                                              fVar102 * auVar16._0_4_))));
              auVar69._28_4_ = SUB84(uStack_488,4);
              auVar69._0_28_ =
                   ZEXT1628(CONCAT412(fVar107 * auVar17._12_4_,
                                      CONCAT48(fVar106 * auVar17._8_4_,
                                               CONCAT44(fVar104 * auVar17._4_4_,
                                                        fVar102 * auVar17._0_4_))));
              auVar169._8_4_ = 0x3f800000;
              auVar169._0_8_ = 0x3f8000003f800000;
              auVar169._12_4_ = 0x3f800000;
              auVar169._16_4_ = 0x3f800000;
              auVar169._20_4_ = 0x3f800000;
              auVar169._24_4_ = 0x3f800000;
              auVar169._28_4_ = 0x3f800000;
              auVar187 = vsubps_avx(auVar169,auVar135);
              auVar187 = vblendvps_avx(auVar187,auVar135,auVar9);
              auVar197 = ZEXT3264(auVar187);
              auVar187 = vsubps_avx(auVar169,auVar69);
              local_3c0 = vblendvps_avx(auVar187,auVar69,auVar9);
              auVar137 = ZEXT3264(local_3c0);
              auVar179 = ZEXT3264(auVar120);
              auVar144 = auVar121;
            }
          }
          auVar205 = ZEXT3264(local_5c0);
          auVar204 = ZEXT3264(local_680);
          auVar199 = ZEXT3264(local_6e0);
          auVar188 = ZEXT3264(local_6c0);
          pRVar80 = (RTCIntersectArguments *)((ulong)pRVar80 & 0xffffffff);
          auVar101 = ZEXT3264(local_740);
          if ((((((((auVar144 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar144 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar144 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar144 >> 0x7f,0) == '\0') &&
                (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar144 >> 0xbf,0) == '\0') &&
              (auVar144 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar144[0x1f]) {
            auVar123 = ZEXT3264(local_720);
            auVar168 = ZEXT3264(CONCAT428(fStack_584,
                                          CONCAT424(fStack_588,
                                                    CONCAT420(fStack_58c,
                                                              CONCAT416(fStack_590,
                                                                        CONCAT412(fStack_594,
                                                                                  CONCAT48(
                                                  fStack_598,CONCAT44(fStack_59c,local_5a0))))))));
            auVar170 = ZEXT3264(local_620);
            goto LAB_010fa72e;
          }
          auVar121 = vsubps_avx(ZEXT1632(auVar14),local_740);
          local_280 = auVar197._0_32_;
          auVar19 = vfmadd213ps_fma(auVar121,local_280,local_740);
          fVar124 = local_7b8->depth_scale;
          auVar70._4_4_ = (auVar19._4_4_ + auVar19._4_4_) * fVar124;
          auVar70._0_4_ = (auVar19._0_4_ + auVar19._0_4_) * fVar124;
          auVar70._8_4_ = (auVar19._8_4_ + auVar19._8_4_) * fVar124;
          auVar70._12_4_ = (auVar19._12_4_ + auVar19._12_4_) * fVar124;
          auVar70._16_4_ = fVar124 * 0.0;
          auVar70._20_4_ = fVar124 * 0.0;
          auVar70._24_4_ = fVar124 * 0.0;
          auVar70._28_4_ = fVar124;
          local_240 = auVar179._0_32_;
          auVar121 = vcmpps_avx(local_240,auVar70,6);
          auVar101 = ZEXT3264(auVar121);
          auVar187 = auVar144 & auVar121;
          auVar168 = ZEXT3264(CONCAT428(fStack_584,
                                        CONCAT424(fStack_588,
                                                  CONCAT420(fStack_58c,
                                                            CONCAT416(fStack_590,
                                                                      CONCAT412(fStack_594,
                                                                                CONCAT48(fStack_598,
                                                                                         CONCAT44(
                                                  fStack_59c,local_5a0))))))));
          auVar170 = ZEXT3264(local_620);
          if ((((((((auVar187 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar187 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar187 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar187 >> 0x7f,0) == '\0') &&
                (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar187 >> 0xbf,0) == '\0') &&
              (auVar187 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar187[0x1f]) {
            auVar123 = ZEXT3264(local_720);
            goto LAB_010fa72e;
          }
          auVar122._8_4_ = 0xbf800000;
          auVar122._0_8_ = 0xbf800000bf800000;
          auVar122._12_4_ = 0xbf800000;
          auVar122._16_4_ = 0xbf800000;
          auVar122._20_4_ = 0xbf800000;
          auVar122._24_4_ = 0xbf800000;
          auVar122._28_4_ = 0xbf800000;
          auVar136._8_4_ = 0x40000000;
          auVar136._0_8_ = 0x4000000040000000;
          auVar136._12_4_ = 0x40000000;
          auVar136._16_4_ = 0x40000000;
          auVar136._20_4_ = 0x40000000;
          auVar136._24_4_ = 0x40000000;
          auVar136._28_4_ = 0x40000000;
          auVar137 = ZEXT3264(auVar136);
          auVar19 = vfmadd213ps_fma(local_3c0,auVar136,auVar122);
          local_260 = ZEXT1632(auVar19);
          local_21c = iVar11;
          local_210 = local_600;
          uStack_208 = uStack_5f8;
          local_200 = local_520._0_8_;
          uStack_1f8 = local_520._8_8_;
          local_1f0 = local_530._0_8_;
          uStack_1e8 = local_530._8_8_;
          pGVar12 = (context->scene->geometries).items[local_6e8].ptr;
          local_3c0 = ZEXT1632(auVar19);
          auVar187 = local_3c0;
          if ((pGVar12->mask & ray->mask) == 0) {
            pRVar80 = (RTCIntersectArguments *)0x0;
            auVar123 = ZEXT3264(local_720);
          }
          else {
            pRVar80 = context->args;
            auVar123 = ZEXT3264(local_720);
            if ((pRVar80->filter != (RTCFilterFunctionN)0x0) ||
               (pRVar80 = (RTCIntersectArguments *)CONCAT71((int7)((ulong)pRVar80 >> 8),1),
               pGVar12->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
              local_660._0_8_ = pGVar12;
              auVar121 = vandps_avx(auVar121,auVar144);
              auVar101 = ZEXT3264(auVar121);
              local_640 = local_280;
              fVar125 = (float)local_220;
              auVar137 = ZEXT3264(CONCAT428(fVar125,CONCAT424(fVar125,CONCAT420(fVar125,CONCAT416(
                                                  fVar125,CONCAT412(fVar125,CONCAT48(fVar125,
                                                  CONCAT44(fVar125,fVar125))))))));
              local_1a0[0] = (fVar125 + auVar197._0_4_ + 0.0) * (float)local_140._0_4_;
              local_1a0[1] = (fVar125 + auVar197._4_4_ + 1.0) * (float)local_140._4_4_;
              local_1a0[2] = (fVar125 + auVar197._8_4_ + 2.0) * fStack_138;
              local_1a0[3] = (fVar125 + auVar197._12_4_ + 3.0) * fStack_134;
              fStack_190 = (fVar125 + auVar197._16_4_ + 4.0) * fStack_130;
              fStack_18c = (fVar125 + auVar197._20_4_ + 5.0) * fStack_12c;
              fStack_188 = (fVar125 + auVar197._24_4_ + 6.0) * fStack_128;
              fStack_184 = fVar125 + auVar197._28_4_ + 7.0;
              local_3c0._0_8_ = auVar19._0_8_;
              local_3c0._8_8_ = auVar19._8_8_;
              local_180 = local_3c0._0_8_;
              uStack_178 = local_3c0._8_8_;
              uStack_170 = 0;
              uStack_168 = 0;
              local_6a0 = local_240;
              local_160 = local_240;
              uVar78 = vmovmskps_avx(auVar121);
              uVar82 = CONCAT44((int)((ulong)pRVar80 >> 0x20),uVar78);
              _local_460 = auVar13;
              local_3c0 = auVar187;
              do {
                lVar24 = 0;
                for (uVar81 = uVar82; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000)
                {
                  lVar24 = lVar24 + 1;
                }
                local_740._0_8_ = lVar24;
                local_7a0._0_8_ = uVar82;
                if (uVar82 == 0) {
                  pRVar80 = (RTCIntersectArguments *)0x0;
                  goto LAB_010fa79a;
                }
                local_504 = local_1a0[lVar24];
                auVar101 = ZEXT464((uint)local_504);
                local_500 = *(undefined4 *)((long)&local_180 + lVar24 * 4);
                local_780._0_4_ = ray->tfar;
                ray->tfar = *(float *)(local_160 + lVar24 * 4);
                local_5f0.context = context->user;
                fVar124 = 1.0 - local_504;
                fVar125 = fVar124 * fVar124 * -3.0;
                auVar19 = vfmadd231ss_fma(ZEXT416((uint)(fVar124 * fVar124)),
                                          ZEXT416((uint)(local_504 * fVar124)),ZEXT416(0xc0000000));
                auVar14 = vfmsub132ss_fma(ZEXT416((uint)(local_504 * fVar124)),
                                          ZEXT416((uint)(local_504 * local_504)),ZEXT416(0x40000000)
                                         );
                fVar124 = auVar19._0_4_ * 3.0;
                fVar103 = auVar14._0_4_ * 3.0;
                fVar105 = local_504 * local_504 * 3.0;
                auVar156._0_4_ = fVar105 * (float)local_4c0._0_4_;
                auVar156._4_4_ = fVar105 * (float)local_4c0._4_4_;
                auVar156._8_4_ = fVar105 * fStack_4b8;
                auVar156._12_4_ = fVar105 * fStack_4b4;
                auVar130._4_4_ = fVar103;
                auVar130._0_4_ = fVar103;
                auVar130._8_4_ = fVar103;
                auVar130._12_4_ = fVar103;
                auVar19 = vfmadd132ps_fma(auVar130,auVar156,local_530);
                auVar142._4_4_ = fVar124;
                auVar142._0_4_ = fVar124;
                auVar142._8_4_ = fVar124;
                auVar142._12_4_ = fVar124;
                auVar19 = vfmadd132ps_fma(auVar142,auVar19,local_520);
                auVar131._4_4_ = fVar125;
                auVar131._0_4_ = fVar125;
                auVar131._8_4_ = fVar125;
                auVar131._12_4_ = fVar125;
                auVar73._8_8_ = uStack_5f8;
                auVar73._0_8_ = local_600;
                auVar19 = vfmadd132ps_fma(auVar131,auVar19,auVar73);
                auVar137 = ZEXT1664(auVar19);
                local_510 = vmovlps_avx(auVar19);
                local_508 = vextractps_avx(auVar19,2);
                local_4fc = local_7a4;
                local_4f8 = (int)local_6e8;
                local_4f4 = (local_5f0.context)->instID[0];
                local_4f0 = (local_5f0.context)->instPrimID[0];
                local_7c4 = -1;
                local_5f0.valid = &local_7c4;
                local_5f0.geometryUserPtr = *(void **)(local_660._0_8_ + 0x18);
                local_5f0.ray = (RTCRayN *)ray;
                local_5f0.hit = (RTCHitN *)&local_510;
                local_5f0.N = 1;
                if (*(code **)(local_660._0_8_ + 0x48) == (code *)0x0) {
LAB_010fa6a7:
                  p_Var83 = context->args->filter;
                  if ((p_Var83 == (RTCFilterFunctionN)0x0) ||
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) ==
                       RTC_RAY_QUERY_FLAG_INCOHERENT &&
                      ((*(byte *)(local_660._0_8_ + 0x3e) & 0x40) == 0)))) goto LAB_010fa794;
                  auVar137 = ZEXT1664(auVar137._0_16_);
                  auVar101._0_8_ = (*p_Var83)(&local_5f0);
                  auVar101._8_56_ = extraout_var_00;
                  if (*local_5f0.valid != 0) goto LAB_010fa794;
                }
                else {
                  auVar137 = ZEXT1664(auVar19);
                  auVar101._0_8_ = (**(code **)(local_660._0_8_ + 0x48))(&local_5f0);
                  auVar101._8_56_ = extraout_var;
                  if (*local_5f0.valid != 0) goto LAB_010fa6a7;
                }
                auVar101 = ZEXT464((uint)local_780._0_4_);
                ray->tfar = (float)local_780._0_4_;
                uVar82 = local_7a0._0_8_ ^ 1L << (local_740._0_8_ & 0x3f);
              } while( true );
            }
          }
          goto LAB_010fa723;
        }
        auVar179 = ZEXT3264(auVar175);
        auVar188 = ZEXT3264(local_6c0);
        auVar199 = ZEXT3264(local_6e0);
        auVar123 = ZEXT3264(local_720);
        auVar204 = ZEXT3264(local_680);
        auVar205 = ZEXT3264(local_5c0);
        auVar168 = ZEXT3264(CONCAT428(fStack_584,
                                      CONCAT424(fStack_588,
                                                CONCAT420(fStack_58c,
                                                          CONCAT416(fStack_590,
                                                                    CONCAT412(fStack_594,
                                                                              CONCAT48(fStack_598,
                                                                                       CONCAT44(
                                                  fStack_59c,local_5a0))))))));
        auVar170 = ZEXT3264(local_620);
        pRVar80 = (RTCIntersectArguments *)((ulong)pRVar80 & 0xffffffff);
        goto LAB_010fa72e;
      }
    }
    if (((ulong)pRVar80 & 1) != 0) break;
    fVar125 = ray->tfar;
    auVar94._4_4_ = fVar125;
    auVar94._0_4_ = fVar125;
    auVar94._8_4_ = fVar125;
    auVar94._12_4_ = fVar125;
    auVar19 = vcmpps_avx(local_2a0,auVar94,2);
    uVar84 = vmovmskps_avx(auVar19);
  }
  return local_4a8 != 0;
LAB_010fa794:
  pRVar80 = (RTCIntersectArguments *)0x1;
LAB_010fa79a:
  auVar197 = ZEXT3264(local_640);
  auVar179 = ZEXT3264(local_6a0);
  auVar188 = ZEXT3264(local_6c0);
  auVar199 = ZEXT3264(local_6e0);
  auVar123 = ZEXT3264(local_720);
  auVar204 = ZEXT3264(local_680);
  auVar205 = ZEXT3264(local_5c0);
  auVar168 = ZEXT3264(CONCAT428(fStack_584,
                                CONCAT424(fStack_588,
                                          CONCAT420(fStack_58c,
                                                    CONCAT416(fStack_590,
                                                              CONCAT412(fStack_594,
                                                                        CONCAT48(fStack_598,
                                                                                 CONCAT44(fStack_59c
                                                                                          ,local_5a0
                                                                                         ))))))));
  auVar170 = ZEXT3264(local_620);
  fVar125 = (float)local_580;
  fVar103 = local_580._4_4_;
  fVar105 = (float)uStack_578;
  fVar206 = uStack_578._4_4_;
  fVar207 = (float)uStack_570;
  fVar208 = uStack_570._4_4_;
  fVar209 = (float)uStack_568;
LAB_010fa723:
  pRVar80 = (RTCIntersectArguments *)(ulong)CONCAT31(local_760._1_3_,local_760[0] | (byte)pRVar80);
LAB_010fa72e:
  lVar88 = lVar88 + 8;
  auVar145 = ZEXT3264(local_560);
  goto LAB_010f9b28;
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }